

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  float fVar96;
  float fVar103;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined4 uVar104;
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar120;
  vint4 bi;
  undefined1 auVar111 [16];
  float fVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar136;
  float fVar137;
  vint4 ai_2;
  float fVar138;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vint4 ai;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vfloat4 a0_3;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  vfloat4 a0_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar199 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar214;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  vfloat4 a0;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  vfloat4 a0_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 uStack_260;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar28;
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  
  PVar3 = prim[1];
  uVar29 = (ulong)(byte)PVar3;
  fVar96 = *(float *)(prim + uVar29 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar38 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar29 * 0x19 + 6));
  auVar56._0_4_ = fVar96 * auVar38._0_4_;
  auVar56._4_4_ = fVar96 * auVar38._4_4_;
  auVar56._8_4_ = fVar96 * auVar38._8_4_;
  auVar56._12_4_ = fVar96 * auVar38._12_4_;
  auVar45._0_4_ = fVar96 * auVar39._0_4_;
  auVar45._4_4_ = fVar96 * auVar39._4_4_;
  auVar45._8_4_ = fVar96 * auVar39._8_4_;
  auVar45._12_4_ = fVar96 * auVar39._12_4_;
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 4 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 5 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xb + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar29 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  uVar37 = (ulong)(uint)((int)(uVar29 * 9) * 2);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 + uVar29 + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  uVar22 = (ulong)(uint)((int)(uVar29 * 5) << 2);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar60._4_4_ = auVar45._0_4_;
  auVar60._0_4_ = auVar45._0_4_;
  auVar60._8_4_ = auVar45._0_4_;
  auVar60._12_4_ = auVar45._0_4_;
  auVar43 = vshufps_avx(auVar45,auVar45,0x55);
  auVar41 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar96 = auVar41._0_4_;
  auVar63._0_4_ = fVar96 * auVar40._0_4_;
  fVar103 = auVar41._4_4_;
  auVar63._4_4_ = fVar103 * auVar40._4_4_;
  fVar213 = auVar41._8_4_;
  auVar63._8_4_ = fVar213 * auVar40._8_4_;
  fVar198 = auVar41._12_4_;
  auVar63._12_4_ = fVar198 * auVar40._12_4_;
  auVar52._0_4_ = auVar49._0_4_ * fVar96;
  auVar52._4_4_ = auVar49._4_4_ * fVar103;
  auVar52._8_4_ = auVar49._8_4_ * fVar213;
  auVar52._12_4_ = auVar49._12_4_ * fVar198;
  auVar46._0_4_ = auVar13._0_4_ * fVar96;
  auVar46._4_4_ = auVar13._4_4_ * fVar103;
  auVar46._8_4_ = auVar13._8_4_ * fVar213;
  auVar46._12_4_ = auVar13._12_4_ * fVar198;
  auVar41 = vfmadd231ps_fma(auVar63,auVar43,auVar39);
  auVar42 = vfmadd231ps_fma(auVar52,auVar43,auVar50);
  auVar43 = vfmadd231ps_fma(auVar46,auVar48,auVar43);
  auVar44 = vfmadd231ps_fma(auVar41,auVar60,auVar38);
  auVar42 = vfmadd231ps_fma(auVar42,auVar60,auVar51);
  auVar45 = vfmadd231ps_fma(auVar43,auVar12,auVar60);
  auVar61._4_4_ = auVar56._0_4_;
  auVar61._0_4_ = auVar56._0_4_;
  auVar61._8_4_ = auVar56._0_4_;
  auVar61._12_4_ = auVar56._0_4_;
  auVar43 = vshufps_avx(auVar56,auVar56,0x55);
  auVar41 = vshufps_avx(auVar56,auVar56,0xaa);
  fVar96 = auVar41._0_4_;
  auVar233._0_4_ = fVar96 * auVar40._0_4_;
  fVar103 = auVar41._4_4_;
  auVar233._4_4_ = fVar103 * auVar40._4_4_;
  fVar213 = auVar41._8_4_;
  auVar233._8_4_ = fVar213 * auVar40._8_4_;
  fVar198 = auVar41._12_4_;
  auVar233._12_4_ = fVar198 * auVar40._12_4_;
  auVar57._0_4_ = auVar49._0_4_ * fVar96;
  auVar57._4_4_ = auVar49._4_4_ * fVar103;
  auVar57._8_4_ = auVar49._8_4_ * fVar213;
  auVar57._12_4_ = auVar49._12_4_ * fVar198;
  auVar58._0_4_ = auVar13._0_4_ * fVar96;
  auVar58._4_4_ = auVar13._4_4_ * fVar103;
  auVar58._8_4_ = auVar13._8_4_ * fVar213;
  auVar58._12_4_ = auVar13._12_4_ * fVar198;
  auVar39 = vfmadd231ps_fma(auVar233,auVar43,auVar39);
  auVar40 = vfmadd231ps_fma(auVar57,auVar43,auVar50);
  auVar50 = vfmadd231ps_fma(auVar58,auVar43,auVar48);
  auVar49 = vfmadd231ps_fma(auVar39,auVar61,auVar38);
  auVar48 = vfmadd231ps_fma(auVar40,auVar61,auVar51);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar242 = ZEXT1664(auVar38);
  auVar13 = vfmadd231ps_fma(auVar50,auVar61,auVar12);
  auVar39 = vandps_avx512vl(auVar44,auVar38);
  auVar53._8_4_ = 0x219392ef;
  auVar53._0_8_ = 0x219392ef219392ef;
  auVar53._12_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar39,auVar53,1);
  bVar31 = (bool)((byte)uVar37 & 1);
  auVar41._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._0_4_;
  bVar31 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._4_4_;
  bVar31 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._8_4_;
  bVar31 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._12_4_;
  auVar39 = vandps_avx512vl(auVar42,auVar38);
  uVar37 = vcmpps_avx512vl(auVar39,auVar53,1);
  bVar31 = (bool)((byte)uVar37 & 1);
  auVar44._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._0_4_;
  bVar31 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._4_4_;
  bVar31 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._8_4_;
  bVar31 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._12_4_;
  auVar38 = vandps_avx512vl(auVar45,auVar38);
  uVar37 = vcmpps_avx512vl(auVar38,auVar53,1);
  bVar31 = (bool)((byte)uVar37 & 1);
  auVar42._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._0_4_;
  bVar31 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._4_4_;
  bVar31 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._8_4_;
  bVar31 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._12_4_;
  auVar38 = vrcp14ps_avx512vl(auVar41);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar243 = ZEXT1664(auVar39);
  auVar40 = vfnmadd213ps_avx512vl(auVar41,auVar38,auVar39);
  auVar51 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
  auVar38 = vrcp14ps_avx512vl(auVar44);
  auVar40 = vfnmadd213ps_avx512vl(auVar44,auVar38,auVar39);
  auVar50 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
  auVar38 = vrcp14ps_avx512vl(auVar42);
  auVar39 = vfnmadd213ps_avx512vl(auVar42,auVar38,auVar39);
  auVar12 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar29 * 7 + 6);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar49);
  auVar139._0_4_ = auVar51._0_4_ * auVar38._0_4_;
  auVar139._4_4_ = auVar51._4_4_ * auVar38._4_4_;
  auVar139._8_4_ = auVar51._8_4_ * auVar38._8_4_;
  auVar139._12_4_ = auVar51._12_4_ * auVar38._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar29 * 9 + 6);
  auVar38 = vpmovsxwd_avx(auVar39);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar49);
  auVar41 = vpbroadcastd_avx512vl();
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar39 = vpmovsxwd_avx(auVar40);
  auVar55._0_4_ = auVar51._0_4_ * auVar38._0_4_;
  auVar55._4_4_ = auVar51._4_4_ * auVar38._4_4_;
  auVar55._8_4_ = auVar51._8_4_ * auVar38._8_4_;
  auVar55._12_4_ = auVar51._12_4_ * auVar38._12_4_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar29 * -2 + 6);
  auVar38 = vpmovsxwd_avx(auVar51);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar48);
  auVar54._0_4_ = auVar50._0_4_ * auVar38._0_4_;
  auVar54._4_4_ = auVar50._4_4_ * auVar38._4_4_;
  auVar54._8_4_ = auVar50._8_4_ * auVar38._8_4_;
  auVar54._12_4_ = auVar50._12_4_ * auVar38._12_4_;
  auVar38 = vcvtdq2ps_avx(auVar39);
  auVar38 = vsubps_avx(auVar38,auVar48);
  auVar59._0_4_ = auVar50._0_4_ * auVar38._0_4_;
  auVar59._4_4_ = auVar50._4_4_ * auVar38._4_4_;
  auVar59._8_4_ = auVar50._8_4_ * auVar38._8_4_;
  auVar59._12_4_ = auVar50._12_4_ * auVar38._12_4_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar22 + uVar29 + 6);
  auVar38 = vpmovsxwd_avx(auVar50);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar13);
  auVar62._0_4_ = auVar12._0_4_ * auVar38._0_4_;
  auVar62._4_4_ = auVar12._4_4_ * auVar38._4_4_;
  auVar62._8_4_ = auVar12._8_4_ * auVar38._8_4_;
  auVar62._12_4_ = auVar12._12_4_ * auVar38._12_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar29 * 0x17 + 6);
  auVar38 = vpmovsxwd_avx(auVar49);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar38 = vsubps_avx(auVar38,auVar13);
  auVar47._0_4_ = auVar12._0_4_ * auVar38._0_4_;
  auVar47._4_4_ = auVar12._4_4_ * auVar38._4_4_;
  auVar47._8_4_ = auVar12._8_4_ * auVar38._8_4_;
  auVar47._12_4_ = auVar12._12_4_ * auVar38._12_4_;
  auVar38 = vpminsd_avx(auVar139,auVar55);
  auVar39 = vpminsd_avx(auVar54,auVar59);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar39 = vpminsd_avx(auVar62,auVar47);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar12._4_4_ = uVar104;
  auVar12._0_4_ = uVar104;
  auVar12._8_4_ = uVar104;
  auVar12._12_4_ = uVar104;
  auVar39 = vmaxps_avx512vl(auVar39,auVar12);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar48._8_4_ = 0x3f7ffffa;
  auVar48._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar48._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar38,auVar48);
  auVar38 = vpmaxsd_avx(auVar139,auVar55);
  auVar39 = vpmaxsd_avx(auVar54,auVar59);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar39 = vpmaxsd_avx(auVar62,auVar47);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar13._4_4_ = uVar104;
  auVar13._0_4_ = uVar104;
  auVar13._8_4_ = uVar104;
  auVar13._12_4_ = uVar104;
  auVar39 = vminps_avx512vl(auVar39,auVar13);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar43._8_4_ = 0x3f800003;
  auVar43._0_8_ = 0x3f8000033f800003;
  auVar43._12_4_ = 0x3f800003;
  auVar38 = vmulps_avx512vl(auVar38,auVar43);
  uVar14 = vcmpps_avx512vl(local_3a0,auVar38,2);
  uVar37 = vpcmpgtd_avx512vl(auVar41,_DAT_01f7fcf0);
  uVar37 = ((byte)uVar14 & 0xf) & uVar37;
  if ((char)uVar37 == '\0') {
    return false;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar246 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar238 = ZEXT1664(auVar38);
  auVar245 = ZEXT464(0x3f800000);
  auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar244 = ZEXT1664(auVar38);
LAB_01ae622f:
  lVar25 = 0;
  for (uVar22 = uVar37; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar30 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar30].ptr;
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar25 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var8 + uVar22 * (long)pvVar7);
  auVar39 = *(undefined1 (*) [16])(_Var8 + (uVar22 + 1) * (long)pvVar7);
  auVar40 = *(undefined1 (*) [16])(_Var8 + (uVar22 + 2) * (long)pvVar7);
  auVar51 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar22 + 3));
  lVar25 = *(long *)&pGVar5[1].time_range.upper;
  auVar50 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * uVar22);
  auVar49 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar22 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar22 + 2));
  uVar37 = uVar37 - 1 & uVar37;
  auVar48 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar22 + 3));
  if (uVar37 != 0) {
    uVar29 = uVar37 - 1 & uVar37;
    for (uVar22 = uVar37; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    }
    if (uVar29 != 0) {
      for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar63 = auVar246._0_16_;
  auVar41 = vmulps_avx512vl(auVar48,auVar63);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar41);
  auVar105._0_4_ = auVar49._0_4_ + auVar43._0_4_;
  auVar105._4_4_ = auVar49._4_4_ + auVar43._4_4_;
  auVar105._8_4_ = auVar49._8_4_ + auVar43._8_4_;
  auVar105._12_4_ = auVar49._12_4_ + auVar43._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar105,auVar50,auVar63);
  auVar52 = ZEXT816(0) << 0x40;
  auVar111._0_4_ = auVar48._0_4_ * 0.0;
  auVar111._4_4_ = auVar48._4_4_ * 0.0;
  auVar111._8_4_ = auVar48._8_4_ * 0.0;
  auVar111._12_4_ = auVar48._12_4_ * 0.0;
  auVar59 = auVar238._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar111,auVar12,auVar59);
  auVar43 = vfmadd231ps_fma(auVar43,auVar49,auVar52);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar50,auVar59);
  auVar45 = vmulps_avx512vl(auVar51,auVar63);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar45);
  auVar225._0_4_ = auVar43._0_4_ + auVar39._0_4_;
  auVar225._4_4_ = auVar43._4_4_ + auVar39._4_4_;
  auVar225._8_4_ = auVar43._8_4_ + auVar39._8_4_;
  auVar225._12_4_ = auVar43._12_4_ + auVar39._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar225,auVar38,auVar63);
  auVar229._0_4_ = auVar51._0_4_ * 0.0;
  auVar229._4_4_ = auVar51._4_4_ * 0.0;
  auVar229._8_4_ = auVar51._8_4_ * 0.0;
  auVar229._12_4_ = auVar51._12_4_ * 0.0;
  auVar43 = vfmadd231ps_avx512vl(auVar229,auVar40,auVar59);
  auVar43 = vfmadd231ps_fma(auVar43,auVar39,auVar52);
  auVar47 = vfnmadd231ps_avx512vl(auVar43,auVar38,auVar59);
  auVar122._0_4_ = auVar12._0_4_ + auVar41._0_4_;
  auVar122._4_4_ = auVar12._4_4_ + auVar41._4_4_;
  auVar122._8_4_ = auVar12._8_4_ + auVar41._8_4_;
  auVar122._12_4_ = auVar12._12_4_ + auVar41._12_4_;
  auVar43 = vfmadd231ps_fma(auVar122,auVar49,auVar52);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar63);
  auVar48 = vmulps_avx512vl(auVar48,auVar59);
  auVar12 = vfmadd231ps_fma(auVar48,auVar52,auVar12);
  auVar49 = vfnmadd231ps_avx512vl(auVar12,auVar59,auVar49);
  auVar12 = vfmadd231ps_fma(auVar49,auVar52,auVar50);
  auVar179._0_4_ = auVar45._0_4_ + auVar40._0_4_;
  auVar179._4_4_ = auVar45._4_4_ + auVar40._4_4_;
  auVar179._8_4_ = auVar45._8_4_ + auVar40._8_4_;
  auVar179._12_4_ = auVar45._12_4_ + auVar40._12_4_;
  auVar50 = vfmadd231ps_fma(auVar179,auVar39,auVar52);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar38,auVar63);
  auVar51 = vmulps_avx512vl(auVar51,auVar59);
  auVar40 = vfmadd231ps_fma(auVar51,auVar52,auVar40);
  auVar39 = vfnmadd231ps_avx512vl(auVar40,auVar59,auVar39);
  auVar49 = vfmadd231ps_fma(auVar39,auVar52,auVar38);
  auVar38 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar209 = auVar44._0_4_;
  auVar149._0_4_ = fVar209 * auVar39._0_4_;
  fVar211 = auVar44._4_4_;
  auVar149._4_4_ = fVar211 * auVar39._4_4_;
  fVar120 = auVar44._8_4_;
  auVar149._8_4_ = fVar120 * auVar39._8_4_;
  fVar121 = auVar44._12_4_;
  auVar149._12_4_ = fVar121 * auVar39._12_4_;
  auVar39 = vfmsub231ps_fma(auVar149,auVar38,auVar46);
  auVar40 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar150._0_4_ = fVar209 * auVar39._0_4_;
  auVar150._4_4_ = fVar211 * auVar39._4_4_;
  auVar150._8_4_ = fVar120 * auVar39._8_4_;
  auVar150._12_4_ = fVar121 * auVar39._12_4_;
  auVar38 = vfmsub231ps_fma(auVar150,auVar38,auVar47);
  auVar51 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar39 = vshufps_avx(auVar50,auVar50,0xc9);
  fVar131 = auVar12._0_4_;
  auVar140._0_4_ = fVar131 * auVar39._0_4_;
  fVar136 = auVar12._4_4_;
  auVar140._4_4_ = fVar136 * auVar39._4_4_;
  fVar137 = auVar12._8_4_;
  auVar140._8_4_ = fVar137 * auVar39._8_4_;
  fVar138 = auVar12._12_4_;
  auVar140._12_4_ = fVar138 * auVar39._12_4_;
  auVar39 = vfmsub231ps_fma(auVar140,auVar38,auVar50);
  auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar180._0_4_ = auVar39._0_4_ * fVar131;
  auVar180._4_4_ = auVar39._4_4_ * fVar136;
  auVar180._8_4_ = auVar39._8_4_ * fVar137;
  auVar180._12_4_ = auVar39._12_4_ * fVar138;
  auVar38 = vfmsub231ps_fma(auVar180,auVar38,auVar49);
  auVar49 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar40,auVar40,0x7f);
  fVar103 = auVar38._0_4_;
  auVar181._4_12_ = ZEXT812(0) << 0x20;
  auVar181._0_4_ = fVar103;
  auVar39 = vrsqrt14ss_avx512f(auVar52,auVar181);
  auVar48 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar96 = auVar39._0_4_;
  fVar96 = auVar48._0_4_ + auVar41._0_4_ * fVar96 * fVar96 * fVar96;
  fVar214 = fVar96 * auVar40._0_4_;
  fVar222 = fVar96 * auVar40._4_4_;
  fVar223 = fVar96 * auVar40._8_4_;
  fVar224 = fVar96 * auVar40._12_4_;
  auVar39 = vdpps_avx(auVar40,auVar51,0x7f);
  auVar192._0_4_ = auVar51._0_4_ * fVar103;
  auVar192._4_4_ = auVar51._4_4_ * fVar103;
  auVar192._8_4_ = auVar51._8_4_ * fVar103;
  auVar192._12_4_ = auVar51._12_4_ * fVar103;
  fVar103 = auVar39._0_4_;
  auVar160._0_4_ = fVar103 * auVar40._0_4_;
  auVar160._4_4_ = fVar103 * auVar40._4_4_;
  auVar160._8_4_ = fVar103 * auVar40._8_4_;
  auVar160._12_4_ = fVar103 * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar192,auVar160);
  auVar39 = vrcp14ss_avx512f(auVar52,auVar181);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar213 = auVar39._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar50,auVar50,0x7f);
  fVar198 = auVar38._0_4_;
  auVar173._4_12_ = ZEXT812(0) << 0x20;
  auVar173._0_4_ = fVar198;
  auVar39 = vrsqrt14ss_avx512f(auVar52,auVar173);
  auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar103 = auVar39._0_4_;
  fVar103 = auVar51._0_4_ + auVar48._0_4_ * fVar103 * fVar103 * fVar103;
  fVar197 = fVar103 * auVar50._0_4_;
  fVar208 = fVar103 * auVar50._4_4_;
  fVar210 = fVar103 * auVar50._8_4_;
  fVar212 = fVar103 * auVar50._12_4_;
  auVar39 = vdpps_avx(auVar50,auVar49,0x7f);
  auVar151._0_4_ = fVar198 * auVar49._0_4_;
  auVar151._4_4_ = fVar198 * auVar49._4_4_;
  auVar151._8_4_ = fVar198 * auVar49._8_4_;
  auVar151._12_4_ = fVar198 * auVar49._12_4_;
  fVar198 = auVar39._0_4_;
  auVar141._0_4_ = fVar198 * auVar50._0_4_;
  auVar141._4_4_ = fVar198 * auVar50._4_4_;
  auVar141._8_4_ = fVar198 * auVar50._8_4_;
  auVar141._12_4_ = fVar198 * auVar50._12_4_;
  auVar51 = vsubps_avx(auVar151,auVar141);
  auVar39 = vrcp14ss_avx512f(auVar52,auVar173);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar39,ZEXT416(0x40000000));
  fVar198 = auVar38._0_4_ * auVar39._0_4_;
  auVar38 = vshufps_avx(auVar42,auVar42,0xff);
  auVar174._0_4_ = fVar214 * auVar38._0_4_;
  auVar174._4_4_ = fVar222 * auVar38._4_4_;
  auVar174._8_4_ = fVar223 * auVar38._8_4_;
  auVar174._12_4_ = fVar224 * auVar38._12_4_;
  local_320 = vsubps_avx(auVar42,auVar174);
  auVar39 = vshufps_avx(auVar44,auVar44,0xff);
  auVar152._0_4_ = auVar39._0_4_ * fVar214 + auVar38._0_4_ * fVar96 * fVar213 * auVar40._0_4_;
  auVar152._4_4_ = auVar39._4_4_ * fVar222 + auVar38._4_4_ * fVar96 * fVar213 * auVar40._4_4_;
  auVar152._8_4_ = auVar39._8_4_ * fVar223 + auVar38._8_4_ * fVar96 * fVar213 * auVar40._8_4_;
  auVar152._12_4_ = auVar39._12_4_ * fVar224 + auVar38._12_4_ * fVar96 * fVar213 * auVar40._12_4_;
  auVar40 = vsubps_avx(auVar44,auVar152);
  local_330._0_4_ = auVar174._0_4_ + auVar42._0_4_;
  local_330._4_4_ = auVar174._4_4_ + auVar42._4_4_;
  fStack_328 = auVar174._8_4_ + auVar42._8_4_;
  fStack_324 = auVar174._12_4_ + auVar42._12_4_;
  auVar38 = vshufps_avx(auVar43,auVar43,0xff);
  auVar153._0_4_ = fVar197 * auVar38._0_4_;
  auVar153._4_4_ = fVar208 * auVar38._4_4_;
  auVar153._8_4_ = fVar210 * auVar38._8_4_;
  auVar153._12_4_ = fVar212 * auVar38._12_4_;
  local_340 = vsubps_avx(auVar43,auVar153);
  auVar39 = vshufps_avx(auVar12,auVar12,0xff);
  auVar112._0_4_ = auVar39._0_4_ * fVar197 + auVar38._0_4_ * fVar103 * auVar51._0_4_ * fVar198;
  auVar112._4_4_ = auVar39._4_4_ * fVar208 + auVar38._4_4_ * fVar103 * auVar51._4_4_ * fVar198;
  auVar112._8_4_ = auVar39._8_4_ * fVar210 + auVar38._8_4_ * fVar103 * auVar51._8_4_ * fVar198;
  auVar112._12_4_ = auVar39._12_4_ * fVar212 + auVar38._12_4_ * fVar103 * auVar51._12_4_ * fVar198;
  auVar38 = vsubps_avx(auVar12,auVar112);
  _local_350 = vaddps_avx512vl(auVar43,auVar153);
  auVar123._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar123._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar123._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar123._12_4_ = auVar40._12_4_ * 0.33333334;
  local_360 = vaddps_avx512vl(local_320,auVar123);
  auVar124._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar124._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar124._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar124._12_4_ = auVar38._12_4_ * 0.33333334;
  local_370 = vsubps_avx512vl(local_340,auVar124);
  auVar106._0_4_ = (fVar209 + auVar152._0_4_) * 0.33333334;
  auVar106._4_4_ = (fVar211 + auVar152._4_4_) * 0.33333334;
  auVar106._8_4_ = (fVar120 + auVar152._8_4_) * 0.33333334;
  auVar106._12_4_ = (fVar121 + auVar152._12_4_) * 0.33333334;
  _local_380 = vaddps_avx512vl(_local_330,auVar106);
  auVar107._0_4_ = (fVar131 + auVar112._0_4_) * 0.33333334;
  auVar107._4_4_ = (fVar136 + auVar112._4_4_) * 0.33333334;
  auVar107._8_4_ = (fVar137 + auVar112._8_4_) * 0.33333334;
  auVar107._12_4_ = (fVar138 + auVar112._12_4_) * 0.33333334;
  _local_390 = vsubps_avx512vl(_local_350,auVar107);
  local_2a0 = vsubps_avx(local_320,auVar13);
  uVar104 = local_2a0._0_4_;
  auVar113._4_4_ = uVar104;
  auVar113._0_4_ = uVar104;
  auVar113._8_4_ = uVar104;
  auVar113._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar39 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar96 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar213 = pre->ray_space[k].vz.field_0.m128[2];
  fVar198 = pre->ray_space[k].vz.field_0.m128[3];
  auVar108._0_4_ = fVar96 * auVar39._0_4_;
  auVar108._4_4_ = fVar103 * auVar39._4_4_;
  auVar108._8_4_ = fVar213 * auVar39._8_4_;
  auVar108._12_4_ = fVar198 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar2,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar113);
  local_2b0 = vsubps_avx512vl(local_360,auVar13);
  uVar104 = local_2b0._0_4_;
  auVar125._4_4_ = uVar104;
  auVar125._0_4_ = uVar104;
  auVar125._8_4_ = uVar104;
  auVar125._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar39 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar114._0_4_ = fVar96 * auVar39._0_4_;
  auVar114._4_4_ = fVar103 * auVar39._4_4_;
  auVar114._8_4_ = fVar213 * auVar39._8_4_;
  auVar114._12_4_ = fVar198 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar2,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar125);
  local_2c0 = vsubps_avx512vl(local_370,auVar13);
  uVar104 = local_2c0._0_4_;
  auVar161._4_4_ = uVar104;
  auVar161._0_4_ = uVar104;
  auVar161._8_4_ = uVar104;
  auVar161._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar39 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar126._0_4_ = fVar96 * auVar39._0_4_;
  auVar126._4_4_ = fVar103 * auVar39._4_4_;
  auVar126._8_4_ = fVar213 * auVar39._8_4_;
  auVar126._12_4_ = fVar198 * auVar39._12_4_;
  auVar38 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar2,auVar38);
  auVar42 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar161);
  local_2d0 = vsubps_avx(local_340,auVar13);
  uVar104 = local_2d0._0_4_;
  auVar162._4_4_ = uVar104;
  auVar162._0_4_ = uVar104;
  auVar162._8_4_ = uVar104;
  auVar162._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar39 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar182._0_4_ = auVar39._0_4_ * fVar96;
  auVar182._4_4_ = auVar39._4_4_ * fVar103;
  auVar182._8_4_ = auVar39._8_4_ * fVar213;
  auVar182._12_4_ = auVar39._12_4_ * fVar198;
  auVar38 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar38);
  auVar44 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar162);
  local_2e0 = vsubps_avx(_local_330,auVar13);
  uVar104 = local_2e0._0_4_;
  auVar163._4_4_ = uVar104;
  auVar163._0_4_ = uVar104;
  auVar163._8_4_ = uVar104;
  auVar163._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar39 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar193._0_4_ = auVar39._0_4_ * fVar96;
  auVar193._4_4_ = auVar39._4_4_ * fVar103;
  auVar193._8_4_ = auVar39._8_4_ * fVar213;
  auVar193._12_4_ = auVar39._12_4_ * fVar198;
  auVar38 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar2,auVar38);
  auVar45 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar163);
  local_2f0 = vsubps_avx512vl(_local_380,auVar13);
  uVar104 = local_2f0._0_4_;
  auVar164._4_4_ = uVar104;
  auVar164._0_4_ = uVar104;
  auVar164._8_4_ = uVar104;
  auVar164._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar39 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar199._0_4_ = auVar39._0_4_ * fVar96;
  auVar199._4_4_ = auVar39._4_4_ * fVar103;
  auVar199._8_4_ = auVar39._8_4_ * fVar213;
  auVar199._12_4_ = auVar39._12_4_ * fVar198;
  auVar38 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar2,auVar38);
  auVar46 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar164);
  local_300 = vsubps_avx512vl(_local_390,auVar13);
  uVar104 = local_300._0_4_;
  auVar165._4_4_ = uVar104;
  auVar165._0_4_ = uVar104;
  auVar165._8_4_ = uVar104;
  auVar165._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_300,local_300,0x55);
  auVar39 = vshufps_avx(local_300,local_300,0xaa);
  auVar215._0_4_ = auVar39._0_4_ * fVar96;
  auVar215._4_4_ = auVar39._4_4_ * fVar103;
  auVar215._8_4_ = auVar39._8_4_ * fVar213;
  auVar215._12_4_ = auVar39._12_4_ * fVar198;
  auVar38 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar38);
  auVar47 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar165);
  local_310 = vsubps_avx512vl(_local_350,auVar13);
  uVar104 = local_310._0_4_;
  auVar97._4_4_ = uVar104;
  auVar97._0_4_ = uVar104;
  auVar97._8_4_ = uVar104;
  auVar97._12_4_ = uVar104;
  auVar38 = vshufps_avx(local_310,local_310,0x55);
  auVar39 = vshufps_avx(local_310,local_310,0xaa);
  auVar154._0_4_ = auVar39._0_4_ * fVar96;
  auVar154._4_4_ = auVar39._4_4_ * fVar103;
  auVar154._8_4_ = auVar39._8_4_ * fVar213;
  auVar154._12_4_ = auVar39._12_4_ * fVar198;
  auVar38 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar38);
  auVar13 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar97);
  auVar40 = vmovlhps_avx(auVar43,auVar45);
  auVar49 = vmovlhps_avx512f(auVar41,auVar46);
  auVar12 = vmovlhps_avx512f(auVar42,auVar47);
  auVar48 = vmovlhps_avx512f(auVar44,auVar13);
  auVar38 = vminps_avx512vl(auVar40,auVar49);
  auVar51 = vmaxps_avx512vl(auVar40,auVar49);
  auVar39 = vminps_avx512vl(auVar12,auVar48);
  auVar39 = vminps_avx(auVar38,auVar39);
  auVar38 = vmaxps_avx512vl(auVar12,auVar48);
  auVar38 = vmaxps_avx(auVar51,auVar38);
  auVar51 = vshufpd_avx(auVar39,auVar39,3);
  auVar50 = vshufpd_avx(auVar38,auVar38,3);
  auVar39 = vminps_avx(auVar39,auVar51);
  auVar38 = vmaxps_avx(auVar38,auVar50);
  auVar39 = vandps_avx512vl(auVar39,auVar242._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar242._0_16_);
  auVar38 = vmaxps_avx(auVar39,auVar38);
  auVar39 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar39,auVar38);
  fVar103 = auVar38._0_4_ * 9.536743e-07;
  auVar166._8_8_ = auVar43._0_8_;
  auVar166._0_8_ = auVar43._0_8_;
  auVar39 = vmovddup_avx512vl(auVar41);
  auVar51 = vmovddup_avx512vl(auVar42);
  auVar183._0_8_ = auVar44._0_8_;
  auVar183._8_8_ = auVar183._0_8_;
  auVar98._4_4_ = fVar103;
  auVar98._0_4_ = fVar103;
  auVar98._8_4_ = fVar103;
  auVar98._12_4_ = fVar103;
  local_1c0._16_4_ = fVar103;
  local_1c0._0_16_ = auVar98;
  local_1c0._20_4_ = fVar103;
  local_1c0._24_4_ = fVar103;
  local_1c0._28_4_ = fVar103;
  auVar38 = vxorps_avx512vl(auVar98,auVar63);
  local_1e0 = auVar38._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  local_200 = vpbroadcastd_avx512vl();
  bVar31 = false;
  uVar22 = 0;
  fVar96 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx512vl(auVar49,auVar40);
  local_280 = vsubps_avx512vl(auVar12,auVar49);
  local_290 = vsubps_avx512vl(auVar48,auVar12);
  local_3b0 = vsubps_avx(_local_330,local_320);
  local_3c0 = vsubps_avx512vl(_local_380,local_360);
  local_3d0 = vsubps_avx512vl(_local_390,local_370);
  _local_3e0 = vsubps_avx512vl(_local_350,local_340);
  local_220 = vpbroadcastd_avx512vl();
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar109 = auVar38;
LAB_01ae6993:
  do {
    auVar50 = vshufps_avx(auVar109,auVar109,0x50);
    auVar230._8_4_ = 0x3f800000;
    auVar230._0_8_ = 0x3f8000003f800000;
    auVar230._12_4_ = 0x3f800000;
    auVar84._16_4_ = 0x3f800000;
    auVar84._0_16_ = auVar230;
    auVar84._20_4_ = 0x3f800000;
    auVar84._24_4_ = 0x3f800000;
    auVar84._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar230,auVar50);
    fVar213 = auVar50._0_4_;
    fVar120 = auVar45._0_4_;
    auVar132._0_4_ = fVar120 * fVar213;
    fVar198 = auVar50._4_4_;
    fVar121 = auVar45._4_4_;
    auVar132._4_4_ = fVar121 * fVar198;
    fVar209 = auVar50._8_4_;
    auVar132._8_4_ = fVar120 * fVar209;
    fVar211 = auVar50._12_4_;
    auVar132._12_4_ = fVar121 * fVar211;
    fVar131 = auVar46._0_4_;
    auVar142._0_4_ = fVar131 * fVar213;
    fVar136 = auVar46._4_4_;
    auVar142._4_4_ = fVar136 * fVar198;
    auVar142._8_4_ = fVar131 * fVar209;
    auVar142._12_4_ = fVar136 * fVar211;
    fVar137 = auVar47._0_4_;
    auVar155._0_4_ = fVar137 * fVar213;
    fVar138 = auVar47._4_4_;
    auVar155._4_4_ = fVar138 * fVar198;
    auVar155._8_4_ = fVar137 * fVar209;
    auVar155._12_4_ = fVar138 * fVar211;
    fVar197 = auVar13._0_4_;
    auVar115._0_4_ = fVar197 * fVar213;
    fVar208 = auVar13._4_4_;
    auVar115._4_4_ = fVar208 * fVar198;
    auVar115._8_4_ = fVar197 * fVar209;
    auVar115._12_4_ = fVar208 * fVar211;
    auVar41 = vfmadd231ps_fma(auVar132,auVar43,auVar166);
    auVar42 = vfmadd231ps_avx512vl(auVar142,auVar43,auVar39);
    auVar44 = vfmadd231ps_avx512vl(auVar155,auVar43,auVar51);
    auVar43 = vfmadd231ps_fma(auVar115,auVar183,auVar43);
    auVar50 = vmovshdup_avx(auVar38);
    fVar198 = auVar38._0_4_;
    fVar213 = (auVar50._0_4_ - fVar198) * 0.04761905;
    auVar78._4_4_ = fVar198;
    auVar78._0_4_ = fVar198;
    auVar78._8_4_ = fVar198;
    auVar78._12_4_ = fVar198;
    auVar78._16_4_ = fVar198;
    auVar78._20_4_ = fVar198;
    auVar78._24_4_ = fVar198;
    auVar78._28_4_ = fVar198;
    auVar68._0_8_ = auVar50._0_8_;
    auVar68._8_8_ = auVar68._0_8_;
    auVar68._16_8_ = auVar68._0_8_;
    auVar68._24_8_ = auVar68._0_8_;
    auVar81 = vsubps_avx(auVar68,auVar78);
    uVar104 = auVar41._0_4_;
    auVar82._4_4_ = uVar104;
    auVar82._0_4_ = uVar104;
    auVar82._8_4_ = uVar104;
    auVar82._12_4_ = uVar104;
    auVar82._16_4_ = uVar104;
    auVar82._20_4_ = uVar104;
    auVar82._24_4_ = uVar104;
    auVar82._28_4_ = uVar104;
    auVar70._8_4_ = 1;
    auVar70._0_8_ = 0x100000001;
    auVar70._12_4_ = 1;
    auVar70._16_4_ = 1;
    auVar70._20_4_ = 1;
    auVar70._24_4_ = 1;
    auVar70._28_4_ = 1;
    auVar80 = ZEXT1632(auVar41);
    auVar79 = vpermps_avx2(auVar70,auVar80);
    auVar64 = vbroadcastss_avx512vl(auVar42);
    auVar74 = ZEXT1632(auVar42);
    auVar65 = vpermps_avx512vl(auVar70,auVar74);
    auVar66 = vbroadcastss_avx512vl(auVar44);
    auVar75 = ZEXT1632(auVar44);
    auVar67 = vpermps_avx512vl(auVar70,auVar75);
    auVar68 = vbroadcastss_avx512vl(auVar43);
    auVar77 = ZEXT1632(auVar43);
    auVar69 = vpermps_avx512vl(auVar70,auVar77);
    auVar83._4_4_ = fVar213;
    auVar83._0_4_ = fVar213;
    auVar83._8_4_ = fVar213;
    auVar83._12_4_ = fVar213;
    auVar83._16_4_ = fVar213;
    auVar83._20_4_ = fVar213;
    auVar83._24_4_ = fVar213;
    auVar83._28_4_ = fVar213;
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar76._16_4_ = 2;
    auVar76._20_4_ = 2;
    auVar76._24_4_ = 2;
    auVar76._28_4_ = 2;
    auVar70 = vpermps_avx512vl(auVar76,auVar80);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar72 = vpermps_avx512vl(auVar71,auVar80);
    auVar73 = vpermps_avx512vl(auVar76,auVar74);
    auVar74 = vpermps_avx512vl(auVar71,auVar74);
    auVar80 = vpermps_avx2(auVar76,auVar75);
    auVar75 = vpermps_avx512vl(auVar71,auVar75);
    auVar76 = vpermps_avx512vl(auVar76,auVar77);
    auVar71 = vpermps_avx512vl(auVar71,auVar77);
    auVar50 = vfmadd132ps_fma(auVar81,auVar78,_DAT_01faff20);
    auVar81 = vsubps_avx(auVar84,ZEXT1632(auVar50));
    auVar77 = vmulps_avx512vl(auVar64,ZEXT1632(auVar50));
    auVar84 = ZEXT1632(auVar50);
    auVar78 = vmulps_avx512vl(auVar65,auVar84);
    auVar43 = vfmadd231ps_fma(auVar77,auVar81,auVar82);
    auVar41 = vfmadd231ps_fma(auVar78,auVar81,auVar79);
    auVar77 = vmulps_avx512vl(auVar66,auVar84);
    auVar78 = vmulps_avx512vl(auVar67,auVar84);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar64);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar65);
    auVar64 = vmulps_avx512vl(auVar68,auVar84);
    auVar82 = ZEXT1632(auVar50);
    auVar65 = vmulps_avx512vl(auVar69,auVar82);
    auVar66 = vfmadd231ps_avx512vl(auVar64,auVar81,auVar66);
    auVar67 = vfmadd231ps_avx512vl(auVar65,auVar81,auVar67);
    fVar209 = auVar50._0_4_;
    fVar211 = auVar50._4_4_;
    auVar64._4_4_ = fVar211 * auVar77._4_4_;
    auVar64._0_4_ = fVar209 * auVar77._0_4_;
    fVar210 = auVar50._8_4_;
    auVar64._8_4_ = fVar210 * auVar77._8_4_;
    fVar212 = auVar50._12_4_;
    auVar64._12_4_ = fVar212 * auVar77._12_4_;
    auVar64._16_4_ = auVar77._16_4_ * 0.0;
    auVar64._20_4_ = auVar77._20_4_ * 0.0;
    auVar64._24_4_ = auVar77._24_4_ * 0.0;
    auVar64._28_4_ = fVar198;
    auVar65._4_4_ = fVar211 * auVar78._4_4_;
    auVar65._0_4_ = fVar209 * auVar78._0_4_;
    auVar65._8_4_ = fVar210 * auVar78._8_4_;
    auVar65._12_4_ = fVar212 * auVar78._12_4_;
    auVar65._16_4_ = auVar78._16_4_ * 0.0;
    auVar65._20_4_ = auVar78._20_4_ * 0.0;
    auVar65._24_4_ = auVar78._24_4_ * 0.0;
    auVar65._28_4_ = auVar79._28_4_;
    auVar43 = vfmadd231ps_fma(auVar64,auVar81,ZEXT1632(auVar43));
    auVar41 = vfmadd231ps_fma(auVar65,auVar81,ZEXT1632(auVar41));
    auVar69._0_4_ = fVar209 * auVar66._0_4_;
    auVar69._4_4_ = fVar211 * auVar66._4_4_;
    auVar69._8_4_ = fVar210 * auVar66._8_4_;
    auVar69._12_4_ = fVar212 * auVar66._12_4_;
    auVar69._16_4_ = auVar66._16_4_ * 0.0;
    auVar69._20_4_ = auVar66._20_4_ * 0.0;
    auVar69._24_4_ = auVar66._24_4_ * 0.0;
    auVar69._28_4_ = 0;
    auVar79._4_4_ = fVar211 * auVar67._4_4_;
    auVar79._0_4_ = fVar209 * auVar67._0_4_;
    auVar79._8_4_ = fVar210 * auVar67._8_4_;
    auVar79._12_4_ = fVar212 * auVar67._12_4_;
    auVar79._16_4_ = auVar67._16_4_ * 0.0;
    auVar79._20_4_ = auVar67._20_4_ * 0.0;
    auVar79._24_4_ = auVar67._24_4_ * 0.0;
    auVar79._28_4_ = auVar66._28_4_;
    auVar42 = vfmadd231ps_fma(auVar69,auVar81,auVar77);
    auVar44 = vfmadd231ps_fma(auVar79,auVar81,auVar78);
    auVar66._28_4_ = auVar78._28_4_;
    auVar66._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * auVar44._12_4_,
                            CONCAT48(fVar210 * auVar44._8_4_,
                                     CONCAT44(fVar211 * auVar44._4_4_,fVar209 * auVar44._0_4_))));
    auVar52 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar212 * auVar42._12_4_,
                                                 CONCAT48(fVar210 * auVar42._8_4_,
                                                          CONCAT44(fVar211 * auVar42._4_4_,
                                                                   fVar209 * auVar42._0_4_)))),
                              auVar81,ZEXT1632(auVar43));
    auVar59 = vfmadd231ps_fma(auVar66,auVar81,ZEXT1632(auVar41));
    auVar79 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar43));
    auVar64 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar41));
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79 = vmulps_avx512vl(auVar79,auVar65);
    auVar64 = vmulps_avx512vl(auVar64,auVar65);
    auVar77._0_4_ = fVar213 * auVar79._0_4_;
    auVar77._4_4_ = fVar213 * auVar79._4_4_;
    auVar77._8_4_ = fVar213 * auVar79._8_4_;
    auVar77._12_4_ = fVar213 * auVar79._12_4_;
    auVar77._16_4_ = fVar213 * auVar79._16_4_;
    auVar77._20_4_ = fVar213 * auVar79._20_4_;
    auVar77._24_4_ = fVar213 * auVar79._24_4_;
    auVar77._28_4_ = 0;
    auVar79 = vmulps_avx512vl(auVar83,auVar64);
    auVar41 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar52),_DAT_01feed00,ZEXT1632(auVar41));
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar59),_DAT_01feed00,ZEXT1632(auVar41));
    auVar119._0_4_ = auVar77._0_4_ + auVar52._0_4_;
    auVar119._4_4_ = auVar77._4_4_ + auVar52._4_4_;
    auVar119._8_4_ = auVar77._8_4_ + auVar52._8_4_;
    auVar119._12_4_ = auVar77._12_4_ + auVar52._12_4_;
    auVar119._16_4_ = auVar77._16_4_ + 0.0;
    auVar119._20_4_ = auVar77._20_4_ + 0.0;
    auVar119._24_4_ = auVar77._24_4_ + 0.0;
    auVar119._28_4_ = 0;
    auVar78 = ZEXT1632(auVar41);
    auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar78);
    auVar68 = vaddps_avx512vl(ZEXT1632(auVar59),auVar79);
    auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar78);
    auVar79 = vsubps_avx(auVar64,auVar67);
    auVar69 = vsubps_avx512vl(auVar66,auVar69);
    auVar67 = vmulps_avx512vl(auVar73,auVar82);
    auVar77 = vmulps_avx512vl(auVar74,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar70);
    auVar70 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar72);
    auVar72 = vmulps_avx512vl(auVar80,auVar82);
    auVar77 = vmulps_avx512vl(auVar75,auVar82);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar81,auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar74);
    auVar74 = vmulps_avx512vl(auVar76,auVar82);
    auVar71 = vmulps_avx512vl(auVar71,auVar82);
    auVar43 = vfmadd231ps_fma(auVar74,auVar81,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar75);
    auVar71 = vmulps_avx512vl(auVar82,auVar72);
    auVar76 = ZEXT1632(auVar50);
    auVar74 = vmulps_avx512vl(auVar76,auVar73);
    auVar67 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar67);
    auVar70 = vfmadd231ps_avx512vl(auVar74,auVar81,auVar70);
    auVar80 = vmulps_avx512vl(auVar76,auVar80);
    auVar71 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar212 * auVar43._12_4_,
                                            CONCAT48(fVar210 * auVar43._8_4_,
                                                     CONCAT44(fVar211 * auVar43._4_4_,
                                                              fVar209 * auVar43._0_4_)))),auVar81,
                         auVar72);
    auVar72 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar73);
    auVar80._4_4_ = fVar211 * auVar71._4_4_;
    auVar80._0_4_ = fVar209 * auVar71._0_4_;
    auVar80._8_4_ = fVar210 * auVar71._8_4_;
    auVar80._12_4_ = fVar212 * auVar71._12_4_;
    auVar80._16_4_ = auVar71._16_4_ * 0.0;
    auVar80._20_4_ = auVar71._20_4_ * 0.0;
    auVar80._24_4_ = auVar71._24_4_ * 0.0;
    auVar80._28_4_ = auVar75._28_4_;
    auVar73 = vmulps_avx512vl(auVar76,auVar72);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar67);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar70,auVar81);
    auVar81 = vsubps_avx512vl(auVar71,auVar67);
    auVar67 = vsubps_avx512vl(auVar72,auVar70);
    auVar70 = vmulps_avx512vl(auVar81,auVar65);
    auVar65 = vmulps_avx512vl(auVar67,auVar65);
    fVar198 = fVar213 * auVar70._0_4_;
    fVar209 = fVar213 * auVar70._4_4_;
    auVar81._4_4_ = fVar209;
    auVar81._0_4_ = fVar198;
    fVar211 = fVar213 * auVar70._8_4_;
    auVar81._8_4_ = fVar211;
    fVar210 = fVar213 * auVar70._12_4_;
    auVar81._12_4_ = fVar210;
    fVar212 = fVar213 * auVar70._16_4_;
    auVar81._16_4_ = fVar212;
    fVar214 = fVar213 * auVar70._20_4_;
    auVar81._20_4_ = fVar214;
    fVar213 = fVar213 * auVar70._24_4_;
    auVar81._24_4_ = fVar213;
    auVar81._28_4_ = auVar70._28_4_;
    auVar65 = vmulps_avx512vl(auVar83,auVar65);
    auVar71 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar78);
    auVar72 = vpermt2ps_avx512vl(auVar73,_DAT_01feed00,auVar78);
    auVar196._0_4_ = auVar80._0_4_ + fVar198;
    auVar196._4_4_ = auVar80._4_4_ + fVar209;
    auVar196._8_4_ = auVar80._8_4_ + fVar211;
    auVar196._12_4_ = auVar80._12_4_ + fVar210;
    auVar196._16_4_ = auVar80._16_4_ + fVar212;
    auVar196._20_4_ = auVar80._20_4_ + fVar214;
    auVar196._24_4_ = auVar80._24_4_ + fVar213;
    auVar196._28_4_ = auVar80._28_4_ + auVar70._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,ZEXT1632(auVar41));
    auVar70 = vaddps_avx512vl(auVar73,auVar65);
    auVar65 = vpermt2ps_avx512vl(auVar65,_DAT_01feed00,ZEXT1632(auVar41));
    auVar81 = vsubps_avx(auVar71,auVar81);
    auVar65 = vsubps_avx512vl(auVar72,auVar65);
    auVar85 = ZEXT1632(auVar52);
    auVar67 = vsubps_avx512vl(auVar80,auVar85);
    auVar86 = ZEXT1632(auVar59);
    auVar74 = vsubps_avx512vl(auVar73,auVar86);
    auVar75 = vsubps_avx512vl(auVar71,auVar64);
    auVar67 = vaddps_avx512vl(auVar67,auVar75);
    auVar75 = vsubps_avx512vl(auVar72,auVar66);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar86,auVar67);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar85,auVar74);
    auVar76 = vmulps_avx512vl(auVar68,auVar67);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar119,auVar74);
    auVar77 = vmulps_avx512vl(auVar69,auVar67);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar79,auVar74);
    auVar78 = vmulps_avx512vl(auVar66,auVar67);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar64,auVar74);
    auVar82 = vmulps_avx512vl(auVar73,auVar67);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar74);
    auVar83 = vmulps_avx512vl(auVar70,auVar67);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar196,auVar74);
    auVar84 = vmulps_avx512vl(auVar65,auVar67);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar81,auVar74);
    auVar67 = vmulps_avx512vl(auVar72,auVar67);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar71,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar76);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar76 = vmaxps_avx512vl(auVar77,auVar78);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar82,auVar83);
    auVar77 = vmaxps_avx512vl(auVar82,auVar83);
    auVar78 = vminps_avx512vl(auVar84,auVar67);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar67 = vmaxps_avx512vl(auVar84,auVar67);
    auVar67 = vmaxps_avx512vl(auVar77,auVar67);
    auVar75 = vmaxps_avx512vl(auVar75,auVar67);
    uVar14 = vcmpps_avx512vl(auVar74,local_1c0,2);
    auVar67._4_4_ = uStack_1dc;
    auVar67._0_4_ = local_1e0;
    auVar67._8_4_ = uStack_1d8;
    auVar67._12_4_ = uStack_1d4;
    auVar67._16_4_ = uStack_1d0;
    auVar67._20_4_ = uStack_1cc;
    auVar67._24_4_ = uStack_1c8;
    auVar67._28_4_ = uStack_1c4;
    uVar15 = vcmpps_avx512vl(auVar75,auVar67,5);
    bVar26 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar26 != 0) {
      auVar74 = vsubps_avx512vl(auVar64,auVar85);
      auVar75 = vsubps_avx512vl(auVar66,auVar86);
      auVar76 = vsubps_avx512vl(auVar71,auVar80);
      auVar74 = vaddps_avx512vl(auVar74,auVar76);
      auVar76 = vsubps_avx512vl(auVar72,auVar73);
      auVar75 = vaddps_avx512vl(auVar75,auVar76);
      auVar76 = vmulps_avx512vl(auVar86,auVar74);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar75,auVar85);
      auVar68 = vmulps_avx512vl(auVar68,auVar74);
      auVar68 = vfnmadd213ps_avx512vl(auVar119,auVar75,auVar68);
      auVar69 = vmulps_avx512vl(auVar69,auVar74);
      auVar69 = vfnmadd213ps_avx512vl(auVar79,auVar75,auVar69);
      auVar79 = vmulps_avx512vl(auVar66,auVar74);
      auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar64);
      auVar79 = vmulps_avx512vl(auVar73,auVar74);
      auVar73 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar80);
      auVar79 = vmulps_avx512vl(auVar70,auVar74);
      auVar70 = vfnmadd213ps_avx512vl(auVar196,auVar75,auVar79);
      auVar79 = vmulps_avx512vl(auVar65,auVar74);
      auVar77 = vfnmadd213ps_avx512vl(auVar81,auVar75,auVar79);
      auVar81 = vmulps_avx512vl(auVar72,auVar74);
      auVar71 = vfnmadd231ps_avx512vl(auVar81,auVar71,auVar75);
      auVar79 = vminps_avx(auVar76,auVar68);
      auVar81 = vmaxps_avx(auVar76,auVar68);
      auVar64 = vminps_avx(auVar69,auVar66);
      auVar64 = vminps_avx(auVar79,auVar64);
      auVar79 = vmaxps_avx(auVar69,auVar66);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      auVar80 = vminps_avx(auVar73,auVar70);
      auVar79 = vmaxps_avx(auVar73,auVar70);
      auVar65 = vminps_avx(auVar77,auVar71);
      auVar80 = vminps_avx(auVar80,auVar65);
      auVar80 = vminps_avx(auVar64,auVar80);
      auVar64 = vmaxps_avx(auVar77,auVar71);
      auVar79 = vmaxps_avx(auVar79,auVar64);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      uVar14 = vcmpps_avx512vl(auVar81,auVar67,5);
      uVar15 = vcmpps_avx512vl(auVar80,local_1c0,2);
      bVar26 = bVar26 & (byte)uVar14 & (byte)uVar15;
      if (bVar26 != 0) {
        auStack_440[uVar22] = (uint)bVar26;
        uVar14 = vmovlps_avx(auVar38);
        (&uStack_260)[uVar22] = uVar14;
        uVar29 = vmovlps_avx(auVar109);
        auStack_1a0[uVar22] = uVar29;
        uVar22 = (ulong)((int)uVar22 + 1);
      }
    }
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar238 = ZEXT1664(auVar38);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT3264(auVar81);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar240 = ZEXT1664(auVar38);
    auVar241 = ZEXT3264(_DAT_01feed20);
LAB_01ae6e9f:
    do {
      do {
        auVar50 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar22 == 0) {
          if (bVar31) {
            return bVar31;
          }
          uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar21._4_4_ = uVar104;
          auVar21._0_4_ = uVar104;
          auVar21._8_4_ = uVar104;
          auVar21._12_4_ = uVar104;
          uVar14 = vcmpps_avx512vl(local_3a0,auVar21,2);
          uVar30 = (uint)uVar37 & (uint)uVar14;
          uVar37 = (ulong)uVar30;
          if (uVar30 == 0) {
            return bVar31;
          }
          goto LAB_01ae622f;
        }
        uVar27 = (int)uVar22 - 1;
        uVar28 = (ulong)uVar27;
        uVar4 = auStack_440[uVar28];
        auVar109._8_8_ = 0;
        auVar109._0_8_ = auStack_1a0[uVar28];
        uVar29 = 0;
        for (uVar24 = (ulong)uVar4; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          uVar29 = uVar29 + 1;
        }
        uVar23 = uVar4 - 1 & uVar4;
        bVar34 = uVar23 == 0;
        auStack_440[uVar28] = uVar23;
        if (bVar34) {
          uVar22 = (ulong)uVar27;
        }
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar29;
        auVar38 = vpunpcklqdq_avx(auVar99,ZEXT416((int)uVar29 + 1));
        auVar38 = vcvtqq2ps_avx512vl(auVar38);
        auVar38 = vmulps_avx512vl(auVar38,auVar240._0_16_);
        uVar104 = *(undefined4 *)((long)&uStack_260 + uVar28 * 8 + 4);
        auVar16._4_4_ = uVar104;
        auVar16._0_4_ = uVar104;
        auVar16._8_4_ = uVar104;
        auVar16._12_4_ = uVar104;
        auVar43 = vmulps_avx512vl(auVar38,auVar16);
        auVar41 = auVar243._0_16_;
        auVar38 = vsubps_avx512vl(auVar41,auVar38);
        uVar104 = *(undefined4 *)(&uStack_260 + uVar28);
        auVar17._4_4_ = uVar104;
        auVar17._0_4_ = uVar104;
        auVar17._8_4_ = uVar104;
        auVar17._12_4_ = uVar104;
        auVar38 = vfmadd231ps_avx512vl(auVar43,auVar38,auVar17);
        auVar43 = vmovshdup_avx(auVar38);
        fVar213 = auVar43._0_4_ - auVar38._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar213));
        if (uVar4 == 0 || bVar34) goto LAB_01ae6993;
        auVar43 = vshufps_avx(auVar109,auVar109,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar213));
        bVar32 = (uint)uVar22 < 4;
        uVar27 = (uint)uVar22 - 4;
        bVar35 = uVar27 == 0;
        bVar33 = (POPCOUNT(uVar27 & 0xff) & 1U) == 0;
        auVar52 = vsubps_avx512vl(auVar41,auVar43);
        fVar198 = auVar43._0_4_;
        auVar143._0_4_ = fVar198 * fVar120;
        fVar209 = auVar43._4_4_;
        auVar143._4_4_ = fVar209 * fVar121;
        fVar211 = auVar43._8_4_;
        auVar143._8_4_ = fVar211 * fVar120;
        fVar210 = auVar43._12_4_;
        auVar143._12_4_ = fVar210 * fVar121;
        auVar156._0_4_ = fVar198 * fVar131;
        auVar156._4_4_ = fVar209 * fVar136;
        auVar156._8_4_ = fVar211 * fVar131;
        auVar156._12_4_ = fVar210 * fVar136;
        auVar167._0_4_ = fVar198 * fVar137;
        auVar167._4_4_ = fVar209 * fVar138;
        auVar167._8_4_ = fVar211 * fVar137;
        auVar167._12_4_ = fVar210 * fVar138;
        auVar127._0_4_ = fVar198 * fVar197;
        auVar127._4_4_ = fVar209 * fVar208;
        auVar127._8_4_ = fVar211 * fVar197;
        auVar127._12_4_ = fVar210 * fVar208;
        auVar43 = vfmadd231ps_fma(auVar143,auVar52,auVar166);
        auVar42 = vfmadd231ps_fma(auVar156,auVar52,auVar39);
        auVar44 = vfmadd231ps_fma(auVar167,auVar52,auVar51);
        auVar52 = vfmadd231ps_fma(auVar127,auVar52,auVar183);
        auVar72._16_16_ = auVar43;
        auVar72._0_16_ = auVar43;
        auVar73._16_16_ = auVar42;
        auVar73._0_16_ = auVar42;
        auVar75._16_16_ = auVar44;
        auVar75._0_16_ = auVar44;
        auVar79 = vpermps_avx512vl(auVar241._0_32_,ZEXT1632(auVar38));
        auVar81 = vsubps_avx(auVar73,auVar72);
        auVar42 = vfmadd213ps_fma(auVar81,auVar79,auVar72);
        auVar81 = vsubps_avx(auVar75,auVar73);
        auVar59 = vfmadd213ps_fma(auVar81,auVar79,auVar73);
        auVar43 = vsubps_avx(auVar52,auVar44);
        auVar74._16_16_ = auVar43;
        auVar74._0_16_ = auVar43;
        auVar43 = vfmadd213ps_fma(auVar74,auVar79,auVar75);
        auVar81 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar42));
        auVar42 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar42));
        auVar81 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar59));
        auVar43 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar59));
        auVar81 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar42));
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar81,auVar79);
        auVar81 = vmulps_avx512vl(auVar81,auVar239._0_32_);
        auVar71._16_16_ = auVar81._16_16_;
        auVar43 = vmulss_avx512f(ZEXT416((uint)fVar213),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar198 = auVar43._0_4_;
        auVar168._0_8_ =
             CONCAT44(auVar139._4_4_ + fVar198 * auVar81._4_4_,
                      auVar139._0_4_ + fVar198 * auVar81._0_4_);
        auVar168._8_4_ = auVar139._8_4_ + fVar198 * auVar81._8_4_;
        auVar168._12_4_ = auVar139._12_4_ + fVar198 * auVar81._12_4_;
        auVar144._0_4_ = fVar198 * auVar81._16_4_;
        auVar144._4_4_ = fVar198 * auVar81._20_4_;
        auVar144._8_4_ = fVar198 * auVar81._24_4_;
        auVar144._12_4_ = fVar198 * auVar81._28_4_;
        auVar58 = vsubps_avx((undefined1  [16])0x0,auVar144);
        auVar59 = vshufpd_avx(auVar139,auVar139,3);
        auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar43 = vsubps_avx(auVar59,auVar139);
        auVar42 = vsubps_avx(auVar63,(undefined1  [16])0x0);
        auVar184._0_4_ = auVar43._0_4_ + auVar42._0_4_;
        auVar184._4_4_ = auVar43._4_4_ + auVar42._4_4_;
        auVar184._8_4_ = auVar43._8_4_ + auVar42._8_4_;
        auVar184._12_4_ = auVar43._12_4_ + auVar42._12_4_;
        auVar43 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar42 = vshufps_avx(auVar168,auVar168,0xb1);
        auVar44 = vshufps_avx(auVar58,auVar58,0xb1);
        auVar52 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar231._4_4_ = auVar184._0_4_;
        auVar231._0_4_ = auVar184._0_4_;
        auVar231._8_4_ = auVar184._0_4_;
        auVar231._12_4_ = auVar184._0_4_;
        auVar55 = vshufps_avx(auVar184,auVar184,0x55);
        fVar198 = auVar55._0_4_;
        auVar194._0_4_ = auVar43._0_4_ * fVar198;
        fVar209 = auVar55._4_4_;
        auVar194._4_4_ = auVar43._4_4_ * fVar209;
        fVar211 = auVar55._8_4_;
        auVar194._8_4_ = auVar43._8_4_ * fVar211;
        fVar210 = auVar55._12_4_;
        auVar194._12_4_ = auVar43._12_4_ * fVar210;
        auVar200._0_4_ = auVar42._0_4_ * fVar198;
        auVar200._4_4_ = auVar42._4_4_ * fVar209;
        auVar200._8_4_ = auVar42._8_4_ * fVar211;
        auVar200._12_4_ = auVar42._12_4_ * fVar210;
        auVar216._0_4_ = auVar44._0_4_ * fVar198;
        auVar216._4_4_ = auVar44._4_4_ * fVar209;
        auVar216._8_4_ = auVar44._8_4_ * fVar211;
        auVar216._12_4_ = auVar44._12_4_ * fVar210;
        auVar185._0_4_ = auVar52._0_4_ * fVar198;
        auVar185._4_4_ = auVar52._4_4_ * fVar209;
        auVar185._8_4_ = auVar52._8_4_ * fVar211;
        auVar185._12_4_ = auVar52._12_4_ * fVar210;
        auVar43 = vfmadd231ps_fma(auVar194,auVar231,auVar139);
        auVar42 = vfmadd231ps_fma(auVar200,auVar231,auVar168);
        auVar57 = vfmadd231ps_fma(auVar216,auVar231,auVar58);
        auVar62 = vfmadd231ps_fma(auVar185,(undefined1  [16])0x0,auVar231);
        auVar55 = vshufpd_avx(auVar43,auVar43,1);
        auVar56 = vshufpd_avx(auVar42,auVar42,1);
        auVar53 = vshufpd_avx512vl(auVar57,auVar57,1);
        auVar54 = vshufpd_avx512vl(auVar62,auVar62,1);
        auVar44 = vminss_avx(auVar43,auVar42);
        auVar43 = vmaxss_avx(auVar42,auVar43);
        auVar52 = vminss_avx(auVar57,auVar62);
        auVar42 = vmaxss_avx(auVar62,auVar57);
        auVar44 = vminss_avx(auVar44,auVar52);
        auVar43 = vmaxss_avx(auVar42,auVar43);
        auVar52 = vminss_avx(auVar55,auVar56);
        auVar42 = vmaxss_avx(auVar56,auVar55);
        auVar55 = vminss_avx512f(auVar53,auVar54);
        auVar56 = vmaxss_avx512f(auVar54,auVar53);
        vmaxss_avx(auVar56,auVar42);
        auVar42 = vminss_avx512f(auVar52,auVar55);
        vucomiss_avx512f(auVar44);
        if ((!bVar32 && !bVar35) &&
           (auVar52 = vucomiss_avx512f(auVar50), bVar36 = bVar35, !bVar32 && !bVar35)) break;
        auVar52 = vucomiss_avx512f(auVar50);
        auVar55 = vucomiss_avx512f(auVar42);
        auVar43 = vucomiss_avx512f(auVar50);
        bVar36 = bVar32 || bVar35;
        bVar33 = bVar32 || bVar35;
        if (!bVar32 && !bVar35) break;
        uVar14 = vcmpps_avx512vl(auVar44,auVar55,5);
        uVar15 = vcmpps_avx512vl(auVar42,auVar55,5);
        uVar27 = (uint)uVar14 & (uint)uVar15;
        bVar9 = (uVar27 & 1) == 0;
        bVar36 = (!bVar32 && !bVar35) && bVar9;
        bVar33 = (!bVar32 && !bVar35) && (uVar27 & 1) == 0;
      } while ((bVar32 || bVar35) || !bVar9);
      auVar56 = auVar244._0_16_;
      vcmpss_avx512f(auVar44,auVar56,1);
      uVar14 = vcmpss_avx512f(auVar43,auVar56,1);
      bVar35 = (bool)((byte)uVar14 & 1);
      auVar71._0_16_ = auVar245._0_16_;
      auVar85._4_28_ = auVar71._4_28_;
      auVar85._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar245._0_4_);
      vucomiss_avx512f(auVar85._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar36 = bVar33 == false;
      auVar87._16_16_ = auVar71._16_16_;
      auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (uint)bVar33 * auVar244._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar55 = auVar86._0_16_;
      auVar89._16_16_ = auVar71._16_16_;
      auVar89._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (uint)bVar33 * auVar244._0_4_ + (uint)!bVar33 * -0x800000;
      auVar50 = auVar88._0_16_;
      uVar14 = vcmpss_avx512f(auVar42,auVar56,1);
      bVar35 = (bool)((byte)uVar14 & 1);
      auVar91._16_16_ = auVar71._16_16_;
      auVar91._0_16_ = auVar245._0_16_;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar245._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      if ((bVar33) || (bVar36)) {
        auVar42 = vucomiss_avx512f(auVar44);
        if ((bVar33) || (bVar36)) {
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar57 = vxorps_avx512vl(auVar44,auVar20);
          auVar42 = vsubss_avx512f(auVar42,auVar44);
          auVar42 = vdivss_avx512f(auVar57,auVar42);
          auVar44 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
          auVar44 = vfmadd213ss_avx512f(auVar44,auVar56,auVar42);
          auVar42 = auVar44;
        }
        else {
          auVar42 = vxorps_avx512vl(auVar42,auVar42);
          vucomiss_avx512f(auVar42);
          auVar44 = ZEXT416(0x3f800000);
          if ((bVar33) || (bVar36)) {
            auVar44 = SUB6416(ZEXT464(0xff800000),0);
            auVar42 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar55 = vminss_avx512f(auVar55,auVar42);
        auVar50 = vmaxss_avx(auVar44,auVar50);
      }
      auVar245 = ZEXT464(0x3f800000);
      uVar14 = vcmpss_avx512f(auVar52,auVar56,1);
      bVar33 = (bool)((byte)uVar14 & 1);
      auVar42 = auVar245._0_16_;
      fVar198 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
      if ((auVar85._0_4_ != fVar198) || (NAN(auVar85._0_4_) || NAN(fVar198))) {
        fVar211 = auVar52._0_4_;
        fVar209 = auVar43._0_4_;
        if ((fVar211 != fVar209) || (NAN(fVar211) || NAN(fVar209))) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar43 = vxorps_avx512vl(auVar43,auVar19);
          auVar186._0_4_ = auVar43._0_4_ / (fVar211 - fVar209);
          auVar186._4_12_ = auVar43._4_12_;
          auVar43 = vsubss_avx512f(auVar42,auVar186);
          auVar43 = vfmadd213ss_avx512f(auVar43,auVar56,auVar186);
          auVar44 = auVar43;
        }
        else if ((fVar209 != 0.0) || (auVar43 = auVar42, auVar44 = ZEXT816(0) << 0x40, NAN(fVar209))
                ) {
          auVar43 = SUB6416(ZEXT464(0xff800000),0);
          auVar44 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar55 = vminss_avx(auVar55,auVar44);
        auVar50 = vmaxss_avx(auVar43,auVar50);
      }
      bVar33 = auVar90._0_4_ != fVar198;
      auVar43 = vminss_avx512f(auVar55,auVar42);
      auVar93._16_16_ = auVar71._16_16_;
      auVar93._0_16_ = auVar55;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar33 * auVar43._0_4_ + (uint)!bVar33 * auVar55._0_4_;
      auVar43 = vmaxss_avx512f(auVar42,auVar50);
      auVar95._16_16_ = auVar71._16_16_;
      auVar95._0_16_ = auVar50;
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar33 * auVar43._0_4_ + (uint)!bVar33 * auVar50._0_4_;
      auVar50 = vmaxss_avx512f(auVar56,auVar92._0_16_);
      auVar43 = vminss_avx512f(auVar94._0_16_,auVar42);
    } while (auVar43._0_4_ < auVar50._0_4_);
    auVar52 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
    auVar57 = vminss_avx512f(ZEXT416((uint)(auVar43._0_4_ + 0.1)),auVar42);
    auVar128._0_8_ = auVar139._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar201._8_8_ = auVar168._0_8_;
    auVar201._0_8_ = auVar168._0_8_;
    auVar217._8_8_ = auVar58._0_8_;
    auVar217._0_8_ = auVar58._0_8_;
    auVar50 = vshufpd_avx(auVar168,auVar168,3);
    auVar43 = vshufpd_avx(auVar58,auVar58,3);
    auVar44 = vshufps_avx(auVar52,auVar57,0);
    auVar56 = vsubps_avx512vl(auVar41,auVar44);
    fVar198 = auVar44._0_4_;
    auVar157._0_4_ = fVar198 * auVar59._0_4_;
    fVar209 = auVar44._4_4_;
    auVar157._4_4_ = fVar209 * auVar59._4_4_;
    fVar211 = auVar44._8_4_;
    auVar157._8_4_ = fVar211 * auVar59._8_4_;
    fVar210 = auVar44._12_4_;
    auVar157._12_4_ = fVar210 * auVar59._12_4_;
    auVar169._0_4_ = fVar198 * auVar50._0_4_;
    auVar169._4_4_ = fVar209 * auVar50._4_4_;
    auVar169._8_4_ = fVar211 * auVar50._8_4_;
    auVar169._12_4_ = fVar210 * auVar50._12_4_;
    auVar234._0_4_ = auVar43._0_4_ * fVar198;
    auVar234._4_4_ = auVar43._4_4_ * fVar209;
    auVar234._8_4_ = auVar43._8_4_ * fVar211;
    auVar234._12_4_ = auVar43._12_4_ * fVar210;
    auVar145._0_4_ = fVar198 * auVar63._0_4_;
    auVar145._4_4_ = fVar209 * auVar63._4_4_;
    auVar145._8_4_ = fVar211 * auVar63._8_4_;
    auVar145._12_4_ = fVar210 * auVar63._12_4_;
    auVar59 = vfmadd231ps_fma(auVar157,auVar56,auVar128);
    auVar63 = vfmadd231ps_fma(auVar169,auVar56,auVar201);
    auVar55 = vfmadd231ps_fma(auVar234,auVar56,auVar217);
    auVar56 = vfmadd231ps_fma(auVar145,auVar56,ZEXT816(0));
    auVar43 = vsubss_avx512f(auVar42,auVar52);
    auVar50 = vmovshdup_avx(auVar109);
    auVar139 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar52._0_4_)),auVar109,auVar43);
    auVar43 = vsubss_avx512f(auVar42,auVar57);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar57._0_4_)),auVar109,auVar43);
    auVar58 = vdivss_avx512f(auVar42,ZEXT416((uint)fVar213));
    auVar50 = vsubps_avx(auVar63,auVar59);
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar44 = vmulps_avx512vl(auVar50,auVar57);
    auVar50 = vsubps_avx(auVar55,auVar63);
    auVar52 = vmulps_avx512vl(auVar50,auVar57);
    auVar50 = vsubps_avx(auVar56,auVar55);
    auVar50 = vmulps_avx512vl(auVar50,auVar57);
    auVar43 = vminps_avx(auVar52,auVar50);
    auVar50 = vmaxps_avx(auVar52,auVar50);
    auVar43 = vminps_avx(auVar44,auVar43);
    auVar50 = vmaxps_avx(auVar44,auVar50);
    auVar44 = vshufpd_avx(auVar43,auVar43,3);
    auVar52 = vshufpd_avx(auVar50,auVar50,3);
    auVar43 = vminps_avx(auVar43,auVar44);
    auVar50 = vmaxps_avx(auVar50,auVar52);
    fVar213 = auVar58._0_4_;
    auVar187._0_4_ = auVar43._0_4_ * fVar213;
    auVar187._4_4_ = auVar43._4_4_ * fVar213;
    auVar187._8_4_ = auVar43._8_4_ * fVar213;
    auVar187._12_4_ = auVar43._12_4_ * fVar213;
    auVar175._0_4_ = fVar213 * auVar50._0_4_;
    auVar175._4_4_ = fVar213 * auVar50._4_4_;
    auVar175._8_4_ = fVar213 * auVar50._8_4_;
    auVar175._12_4_ = fVar213 * auVar50._12_4_;
    auVar58 = vdivss_avx512f(auVar42,ZEXT416((uint)(auVar53._0_4_ - auVar139._0_4_)));
    auVar50 = vshufpd_avx(auVar59,auVar59,3);
    auVar43 = vshufpd_avx(auVar63,auVar63,3);
    auVar44 = vshufpd_avx(auVar55,auVar55,3);
    auVar52 = vshufpd_avx(auVar56,auVar56,3);
    auVar50 = vsubps_avx(auVar50,auVar59);
    auVar59 = vsubps_avx(auVar43,auVar63);
    auVar63 = vsubps_avx(auVar44,auVar55);
    auVar52 = vsubps_avx(auVar52,auVar56);
    auVar43 = vminps_avx(auVar50,auVar59);
    auVar50 = vmaxps_avx(auVar50,auVar59);
    auVar44 = vminps_avx(auVar63,auVar52);
    auVar44 = vminps_avx(auVar43,auVar44);
    auVar43 = vmaxps_avx(auVar63,auVar52);
    auVar50 = vmaxps_avx(auVar50,auVar43);
    fVar213 = auVar58._0_4_;
    auVar218._0_4_ = fVar213 * auVar44._0_4_;
    auVar218._4_4_ = fVar213 * auVar44._4_4_;
    auVar218._8_4_ = fVar213 * auVar44._8_4_;
    auVar218._12_4_ = fVar213 * auVar44._12_4_;
    auVar202._0_4_ = fVar213 * auVar50._0_4_;
    auVar202._4_4_ = fVar213 * auVar50._4_4_;
    auVar202._8_4_ = fVar213 * auVar50._8_4_;
    auVar202._12_4_ = fVar213 * auVar50._12_4_;
    auVar52 = vinsertps_avx(auVar38,auVar139,0x10);
    auVar54 = vpermt2ps_avx512vl(auVar38,_DAT_01feecd0,auVar53);
    auVar110._0_4_ = auVar52._0_4_ + auVar54._0_4_;
    auVar110._4_4_ = auVar52._4_4_ + auVar54._4_4_;
    auVar110._8_4_ = auVar52._8_4_ + auVar54._8_4_;
    auVar110._12_4_ = auVar52._12_4_ + auVar54._12_4_;
    auVar58 = vmulps_avx512vl(auVar110,auVar238._0_16_);
    auVar43 = vshufps_avx(auVar58,auVar58,0x54);
    uVar104 = auVar58._0_4_;
    auVar116._4_4_ = uVar104;
    auVar116._0_4_ = uVar104;
    auVar116._8_4_ = uVar104;
    auVar116._12_4_ = uVar104;
    auVar44 = vfmadd213ps_fma(local_270,auVar116,auVar40);
    auVar59 = vfmadd213ps_fma(local_280,auVar116,auVar49);
    auVar63 = vfmadd213ps_fma(local_290,auVar116,auVar12);
    auVar50 = vsubps_avx(auVar59,auVar44);
    auVar44 = vfmadd213ps_fma(auVar50,auVar116,auVar44);
    auVar50 = vsubps_avx(auVar63,auVar59);
    auVar50 = vfmadd213ps_fma(auVar50,auVar116,auVar59);
    auVar50 = vsubps_avx(auVar50,auVar44);
    auVar44 = vfmadd231ps_fma(auVar44,auVar50,auVar116);
    auVar55 = vmulps_avx512vl(auVar50,auVar57);
    auVar226._8_8_ = auVar44._0_8_;
    auVar226._0_8_ = auVar44._0_8_;
    auVar50 = vshufpd_avx(auVar44,auVar44,3);
    auVar44 = vshufps_avx(auVar58,auVar58,0x55);
    auVar59 = vsubps_avx(auVar50,auVar226);
    auVar63 = vfmadd231ps_fma(auVar226,auVar44,auVar59);
    auVar235._8_8_ = auVar55._0_8_;
    auVar235._0_8_ = auVar55._0_8_;
    auVar50 = vshufpd_avx(auVar55,auVar55,3);
    auVar50 = vsubps_avx512vl(auVar50,auVar235);
    auVar50 = vfmadd213ps_avx512vl(auVar50,auVar44,auVar235);
    auVar44 = vxorps_avx512vl(auVar59,auVar246._0_16_);
    auVar55 = vmovshdup_avx512vl(auVar50);
    auVar56 = vxorps_avx512vl(auVar55,auVar246._0_16_);
    auVar57 = vmovshdup_avx512vl(auVar59);
    auVar56 = vpermt2ps_avx512vl(auVar56,ZEXT416(5),auVar59);
    auVar59 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar59._0_4_)),auVar50,auVar57);
    auVar44 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar44);
    auVar146._0_4_ = auVar59._0_4_;
    auVar146._4_4_ = auVar146._0_4_;
    auVar146._8_4_ = auVar146._0_4_;
    auVar146._12_4_ = auVar146._0_4_;
    auVar50 = vdivps_avx(auVar56,auVar146);
    auVar60 = vdivps_avx512vl(auVar44,auVar146);
    fVar213 = auVar63._0_4_;
    auVar44 = vshufps_avx(auVar63,auVar63,0x55);
    auVar227._0_4_ = fVar213 * auVar50._0_4_ + auVar44._0_4_ * auVar60._0_4_;
    auVar227._4_4_ = fVar213 * auVar50._4_4_ + auVar44._4_4_ * auVar60._4_4_;
    auVar227._8_4_ = fVar213 * auVar50._8_4_ + auVar44._8_4_ * auVar60._8_4_;
    auVar227._12_4_ = fVar213 * auVar50._12_4_ + auVar44._12_4_ * auVar60._12_4_;
    auVar57 = vsubps_avx(auVar43,auVar227);
    auVar44 = vmovshdup_avx(auVar50);
    auVar43 = vinsertps_avx(auVar187,auVar218,0x1c);
    auVar236._0_4_ = auVar44._0_4_ * auVar43._0_4_;
    auVar236._4_4_ = auVar44._4_4_ * auVar43._4_4_;
    auVar236._8_4_ = auVar44._8_4_ * auVar43._8_4_;
    auVar236._12_4_ = auVar44._12_4_ * auVar43._12_4_;
    auVar62 = vinsertps_avx512f(auVar175,auVar202,0x1c);
    auVar44 = vmulps_avx512vl(auVar44,auVar62);
    auVar56 = vminps_avx512vl(auVar236,auVar44);
    auVar63 = vmaxps_avx(auVar44,auVar236);
    auVar55 = vmovshdup_avx(auVar60);
    auVar44 = vinsertps_avx(auVar218,auVar187,0x4c);
    auVar219._0_4_ = auVar55._0_4_ * auVar44._0_4_;
    auVar219._4_4_ = auVar55._4_4_ * auVar44._4_4_;
    auVar219._8_4_ = auVar55._8_4_ * auVar44._8_4_;
    auVar219._12_4_ = auVar55._12_4_ * auVar44._12_4_;
    auVar59 = vinsertps_avx(auVar202,auVar175,0x4c);
    auVar203._0_4_ = auVar55._0_4_ * auVar59._0_4_;
    auVar203._4_4_ = auVar55._4_4_ * auVar59._4_4_;
    auVar203._8_4_ = auVar55._8_4_ * auVar59._8_4_;
    auVar203._12_4_ = auVar55._12_4_ * auVar59._12_4_;
    auVar55 = vminps_avx(auVar219,auVar203);
    auVar56 = vaddps_avx512vl(auVar56,auVar55);
    auVar55 = vmaxps_avx(auVar203,auVar219);
    auVar204._0_4_ = auVar63._0_4_ + auVar55._0_4_;
    auVar204._4_4_ = auVar63._4_4_ + auVar55._4_4_;
    auVar204._8_4_ = auVar63._8_4_ + auVar55._8_4_;
    auVar204._12_4_ = auVar63._12_4_ + auVar55._12_4_;
    auVar220._8_8_ = 0x3f80000000000000;
    auVar220._0_8_ = 0x3f80000000000000;
    auVar63 = vsubps_avx(auVar220,auVar204);
    auVar55 = vsubps_avx(auVar220,auVar56);
    auVar56 = vsubps_avx(auVar52,auVar58);
    auVar58 = vsubps_avx(auVar54,auVar58);
    fVar210 = auVar56._0_4_;
    auVar237._0_4_ = fVar210 * auVar63._0_4_;
    fVar212 = auVar56._4_4_;
    auVar237._4_4_ = fVar212 * auVar63._4_4_;
    fVar214 = auVar56._8_4_;
    auVar237._8_4_ = fVar214 * auVar63._8_4_;
    fVar222 = auVar56._12_4_;
    auVar237._12_4_ = fVar222 * auVar63._12_4_;
    auVar61 = vbroadcastss_avx512vl(auVar50);
    auVar43 = vmulps_avx512vl(auVar61,auVar43);
    auVar62 = vmulps_avx512vl(auVar61,auVar62);
    auVar61 = vminps_avx512vl(auVar43,auVar62);
    auVar62 = vmaxps_avx512vl(auVar62,auVar43);
    auVar43 = vbroadcastss_avx512vl(auVar60);
    auVar44 = vmulps_avx512vl(auVar43,auVar44);
    auVar43 = vmulps_avx512vl(auVar43,auVar59);
    auVar59 = vminps_avx512vl(auVar44,auVar43);
    auVar59 = vaddps_avx512vl(auVar61,auVar59);
    auVar56 = vmulps_avx512vl(auVar56,auVar55);
    fVar213 = auVar58._0_4_;
    auVar205._0_4_ = fVar213 * auVar63._0_4_;
    fVar198 = auVar58._4_4_;
    auVar205._4_4_ = fVar198 * auVar63._4_4_;
    fVar209 = auVar58._8_4_;
    auVar205._8_4_ = fVar209 * auVar63._8_4_;
    fVar211 = auVar58._12_4_;
    auVar205._12_4_ = fVar211 * auVar63._12_4_;
    auVar221._0_4_ = fVar213 * auVar55._0_4_;
    auVar221._4_4_ = fVar198 * auVar55._4_4_;
    auVar221._8_4_ = fVar209 * auVar55._8_4_;
    auVar221._12_4_ = fVar211 * auVar55._12_4_;
    auVar43 = vmaxps_avx(auVar43,auVar44);
    auVar176._0_4_ = auVar62._0_4_ + auVar43._0_4_;
    auVar176._4_4_ = auVar62._4_4_ + auVar43._4_4_;
    auVar176._8_4_ = auVar62._8_4_ + auVar43._8_4_;
    auVar176._12_4_ = auVar62._12_4_ + auVar43._12_4_;
    auVar188._8_8_ = 0x3f800000;
    auVar188._0_8_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar188,auVar176);
    auVar44 = vsubps_avx512vl(auVar188,auVar59);
    auVar232._0_4_ = fVar210 * auVar43._0_4_;
    auVar232._4_4_ = fVar212 * auVar43._4_4_;
    auVar232._8_4_ = fVar214 * auVar43._8_4_;
    auVar232._12_4_ = fVar222 * auVar43._12_4_;
    auVar228._0_4_ = fVar210 * auVar44._0_4_;
    auVar228._4_4_ = fVar212 * auVar44._4_4_;
    auVar228._8_4_ = fVar214 * auVar44._8_4_;
    auVar228._12_4_ = fVar222 * auVar44._12_4_;
    auVar177._0_4_ = fVar213 * auVar43._0_4_;
    auVar177._4_4_ = fVar198 * auVar43._4_4_;
    auVar177._8_4_ = fVar209 * auVar43._8_4_;
    auVar177._12_4_ = fVar211 * auVar43._12_4_;
    auVar189._0_4_ = fVar213 * auVar44._0_4_;
    auVar189._4_4_ = fVar198 * auVar44._4_4_;
    auVar189._8_4_ = fVar209 * auVar44._8_4_;
    auVar189._12_4_ = fVar211 * auVar44._12_4_;
    auVar43 = vminps_avx(auVar232,auVar228);
    auVar44 = vminps_avx512vl(auVar177,auVar189);
    auVar59 = vminps_avx512vl(auVar43,auVar44);
    auVar43 = vmaxps_avx(auVar228,auVar232);
    auVar44 = vmaxps_avx(auVar189,auVar177);
    auVar44 = vmaxps_avx(auVar44,auVar43);
    auVar63 = vminps_avx512vl(auVar237,auVar56);
    auVar43 = vminps_avx(auVar205,auVar221);
    auVar43 = vminps_avx(auVar63,auVar43);
    auVar43 = vhaddps_avx(auVar59,auVar43);
    auVar63 = vmaxps_avx512vl(auVar56,auVar237);
    auVar59 = vmaxps_avx(auVar221,auVar205);
    auVar59 = vmaxps_avx(auVar59,auVar63);
    auVar44 = vhaddps_avx(auVar44,auVar59);
    auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar178._0_4_ = auVar43._0_4_ + auVar57._0_4_;
    auVar178._4_4_ = auVar43._4_4_ + auVar57._4_4_;
    auVar178._8_4_ = auVar43._8_4_ + auVar57._8_4_;
    auVar178._12_4_ = auVar43._12_4_ + auVar57._12_4_;
    auVar190._0_4_ = auVar44._0_4_ + auVar57._0_4_;
    auVar190._4_4_ = auVar44._4_4_ + auVar57._4_4_;
    auVar190._8_4_ = auVar44._8_4_ + auVar57._8_4_;
    auVar190._12_4_ = auVar44._12_4_ + auVar57._12_4_;
    auVar43 = vmaxps_avx(auVar52,auVar178);
    auVar44 = vminps_avx(auVar190,auVar54);
    uVar29 = vcmpps_avx512vl(auVar44,auVar43,1);
    auVar43 = ZEXT416(5);
    if ((uVar29 & 3) != 0) {
      auVar38 = vxorps_avx512vl(ZEXT416(5),auVar43);
      auVar244 = ZEXT1664(auVar38);
      goto LAB_01ae6e9f;
    }
    uVar29 = vcmpps_avx512vl(auVar190,auVar54,1);
    uVar14 = vcmpps_avx512vl(auVar38,auVar178,1);
    if (((ushort)uVar14 & (ushort)uVar29 & 1) == 0) {
      bVar26 = 0;
    }
    else {
      auVar44 = vmovshdup_avx(auVar178);
      bVar26 = auVar139._0_4_ < auVar44._0_4_ & (byte)(uVar29 >> 1) & 0x7f;
    }
    auVar43 = vxorps_avx512vl(auVar43,auVar43);
    auVar244 = ZEXT1664(auVar43);
    local_450 = auVar48._0_4_;
    fStack_44c = auVar48._4_4_;
    fStack_448 = auVar48._8_4_;
    fStack_444 = auVar48._12_4_;
    if (((!bVar32 || uVar4 != 0 && !bVar34) | bVar26) == 1) {
      lVar25 = 200;
      do {
        auVar38 = vsubss_avx512f(auVar42,auVar57);
        fVar209 = auVar38._0_4_;
        fVar213 = fVar209 * fVar209 * fVar209;
        fVar211 = auVar57._0_4_;
        fVar198 = fVar211 * 3.0 * fVar209 * fVar209;
        fVar209 = fVar209 * fVar211 * fVar211 * 3.0;
        auVar133._4_4_ = fVar213;
        auVar133._0_4_ = fVar213;
        auVar133._8_4_ = fVar213;
        auVar133._12_4_ = fVar213;
        auVar129._4_4_ = fVar198;
        auVar129._0_4_ = fVar198;
        auVar129._8_4_ = fVar198;
        auVar129._12_4_ = fVar198;
        auVar100._4_4_ = fVar209;
        auVar100._0_4_ = fVar209;
        auVar100._8_4_ = fVar209;
        auVar100._12_4_ = fVar209;
        fVar211 = fVar211 * fVar211 * fVar211;
        auVar158._0_4_ = local_450 * fVar211;
        auVar158._4_4_ = fStack_44c * fVar211;
        auVar158._8_4_ = fStack_448 * fVar211;
        auVar158._12_4_ = fStack_444 * fVar211;
        auVar38 = vfmadd231ps_fma(auVar158,auVar12,auVar100);
        auVar38 = vfmadd231ps_fma(auVar38,auVar49,auVar129);
        auVar38 = vfmadd231ps_fma(auVar38,auVar40,auVar133);
        auVar101._8_8_ = auVar38._0_8_;
        auVar101._0_8_ = auVar38._0_8_;
        auVar38 = vshufpd_avx(auVar38,auVar38,3);
        auVar44 = vshufps_avx(auVar57,auVar57,0x55);
        auVar38 = vsubps_avx(auVar38,auVar101);
        auVar44 = vfmadd213ps_fma(auVar38,auVar44,auVar101);
        fVar213 = auVar44._0_4_;
        auVar38 = vshufps_avx(auVar44,auVar44,0x55);
        auVar102._0_4_ = auVar50._0_4_ * fVar213 + auVar60._0_4_ * auVar38._0_4_;
        auVar102._4_4_ = auVar50._4_4_ * fVar213 + auVar60._4_4_ * auVar38._4_4_;
        auVar102._8_4_ = auVar50._8_4_ * fVar213 + auVar60._8_4_ * auVar38._8_4_;
        auVar102._12_4_ = auVar50._12_4_ * fVar213 + auVar60._12_4_ * auVar38._12_4_;
        auVar57 = vsubps_avx(auVar57,auVar102);
        auVar38 = vandps_avx512vl(auVar44,auVar242._0_16_);
        auVar44 = vprolq_avx512vl(auVar38,0x20);
        auVar38 = vmaxss_avx(auVar44,auVar38);
        bVar34 = auVar38._0_4_ <= fVar103;
        if (auVar38._0_4_ < fVar103) {
          auVar38 = vucomiss_avx512f(auVar43);
          if (bVar34) {
            auVar50 = vucomiss_avx512f(auVar38);
            auVar245 = ZEXT1664(auVar50);
            if (bVar34) {
              vmovshdup_avx(auVar38);
              auVar50 = vucomiss_avx512f(auVar43);
              if (bVar34) {
                auVar42 = vucomiss_avx512f(auVar50);
                auVar245 = ZEXT1664(auVar42);
                if (bVar34) {
                  auVar44 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar57 = vinsertps_avx(auVar44,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar44 = vdpps_avx(auVar57,local_2a0,0x7f);
                  auVar52 = vdpps_avx(auVar57,local_2b0,0x7f);
                  auVar59 = vdpps_avx(auVar57,local_2c0,0x7f);
                  auVar63 = vdpps_avx(auVar57,local_2d0,0x7f);
                  auVar55 = vdpps_avx(auVar57,local_2e0,0x7f);
                  auVar56 = vdpps_avx(auVar57,local_2f0,0x7f);
                  auVar58 = vdpps_avx(auVar57,local_300,0x7f);
                  auVar57 = vdpps_avx(auVar57,local_310,0x7f);
                  auVar62 = vsubss_avx512f(auVar42,auVar50);
                  fVar213 = auVar50._0_4_;
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar55._0_4_)),auVar62,auVar44
                                           );
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar213)),auVar62,auVar52
                                           );
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar213)),auVar62,auVar59
                                           );
                  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar57._0_4_)),auVar62,auVar63
                                           );
                  auVar42 = vsubss_avx512f(auVar42,auVar38);
                  auVar159._0_4_ = auVar42._0_4_;
                  fVar213 = auVar159._0_4_ * auVar159._0_4_ * auVar159._0_4_;
                  local_120 = auVar38._0_4_;
                  fVar198 = local_120 * 3.0 * auVar159._0_4_ * auVar159._0_4_;
                  fVar209 = auVar159._0_4_ * local_120 * local_120 * 3.0;
                  fVar210 = local_120 * local_120 * local_120;
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar59._0_4_)),
                                            ZEXT416((uint)fVar209),auVar52);
                  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar198),auVar44);
                  auVar50 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar213),auVar50);
                  fVar211 = auVar50._0_4_;
                  if ((fVar96 <= fVar211) &&
                     (fVar212 = *(float *)(ray + k * 4 + 0x100), fVar211 <= fVar212)) {
                    auVar50 = vshufps_avx(auVar38,auVar38,0x55);
                    auVar44 = vsubps_avx512vl(auVar41,auVar50);
                    fVar214 = auVar50._0_4_;
                    auVar191._0_4_ = fVar214 * (float)local_330._0_4_;
                    fVar222 = auVar50._4_4_;
                    auVar191._4_4_ = fVar222 * (float)local_330._4_4_;
                    fVar223 = auVar50._8_4_;
                    auVar191._8_4_ = fVar223 * fStack_328;
                    fVar224 = auVar50._12_4_;
                    auVar191._12_4_ = fVar224 * fStack_324;
                    auVar195._0_4_ = fVar214 * (float)local_380._0_4_;
                    auVar195._4_4_ = fVar222 * (float)local_380._4_4_;
                    auVar195._8_4_ = fVar223 * fStack_378;
                    auVar195._12_4_ = fVar224 * fStack_374;
                    auVar206._0_4_ = fVar214 * (float)local_390._0_4_;
                    auVar206._4_4_ = fVar222 * (float)local_390._4_4_;
                    auVar206._8_4_ = fVar223 * fStack_388;
                    auVar206._12_4_ = fVar224 * fStack_384;
                    auVar170._0_4_ = fVar214 * (float)local_350._0_4_;
                    auVar170._4_4_ = fVar222 * (float)local_350._4_4_;
                    auVar170._8_4_ = fVar223 * fStack_348;
                    auVar170._12_4_ = fVar224 * fStack_344;
                    auVar50 = vfmadd231ps_fma(auVar191,auVar44,local_320);
                    auVar41 = vfmadd231ps_fma(auVar195,auVar44,local_360);
                    auVar42 = vfmadd231ps_fma(auVar206,auVar44,local_370);
                    auVar44 = vfmadd231ps_fma(auVar170,auVar44,local_340);
                    auVar50 = vsubps_avx(auVar41,auVar50);
                    auVar41 = vsubps_avx(auVar42,auVar41);
                    auVar42 = vsubps_avx(auVar44,auVar42);
                    auVar207._0_4_ = local_120 * auVar41._0_4_;
                    auVar207._4_4_ = local_120 * auVar41._4_4_;
                    auVar207._8_4_ = local_120 * auVar41._8_4_;
                    auVar207._12_4_ = local_120 * auVar41._12_4_;
                    auVar159._4_4_ = auVar159._0_4_;
                    auVar159._8_4_ = auVar159._0_4_;
                    auVar159._12_4_ = auVar159._0_4_;
                    auVar50 = vfmadd231ps_fma(auVar207,auVar159,auVar50);
                    auVar171._0_4_ = local_120 * auVar42._0_4_;
                    auVar171._4_4_ = local_120 * auVar42._4_4_;
                    auVar171._8_4_ = local_120 * auVar42._8_4_;
                    auVar171._12_4_ = local_120 * auVar42._12_4_;
                    auVar41 = vfmadd231ps_fma(auVar171,auVar159,auVar41);
                    auVar172._0_4_ = local_120 * auVar41._0_4_;
                    auVar172._4_4_ = local_120 * auVar41._4_4_;
                    auVar172._8_4_ = local_120 * auVar41._8_4_;
                    auVar172._12_4_ = local_120 * auVar41._12_4_;
                    auVar50 = vfmadd231ps_fma(auVar172,auVar159,auVar50);
                    auVar18._8_4_ = 0x40400000;
                    auVar18._0_8_ = 0x4040000040400000;
                    auVar18._12_4_ = 0x40400000;
                    auVar50 = vmulps_avx512vl(auVar50,auVar18);
                    pGVar5 = (context->scene->geometries).items[uVar30].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01ae7cec:
                      bVar26 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar26 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar147._0_4_ = fVar210 * (float)local_3e0._0_4_;
                      auVar147._4_4_ = fVar210 * (float)local_3e0._4_4_;
                      auVar147._8_4_ = fVar210 * fStack_3d8;
                      auVar147._12_4_ = fVar210 * fStack_3d4;
                      auVar134._4_4_ = fVar209;
                      auVar134._0_4_ = fVar209;
                      auVar134._8_4_ = fVar209;
                      auVar134._12_4_ = fVar209;
                      auVar41 = vfmadd132ps_fma(auVar134,auVar147,local_3d0);
                      auVar130._4_4_ = fVar198;
                      auVar130._0_4_ = fVar198;
                      auVar130._8_4_ = fVar198;
                      auVar130._12_4_ = fVar198;
                      auVar41 = vfmadd132ps_fma(auVar130,auVar41,local_3c0);
                      auVar117._4_4_ = fVar213;
                      auVar117._0_4_ = fVar213;
                      auVar117._8_4_ = fVar213;
                      auVar117._12_4_ = fVar213;
                      auVar44 = vfmadd132ps_fma(auVar117,auVar41,local_3b0);
                      auVar41 = vshufps_avx(auVar44,auVar44,0xc9);
                      auVar42 = vshufps_avx(auVar50,auVar50,0xc9);
                      auVar118._0_4_ = auVar44._0_4_ * auVar42._0_4_;
                      auVar118._4_4_ = auVar44._4_4_ * auVar42._4_4_;
                      auVar118._8_4_ = auVar44._8_4_ * auVar42._8_4_;
                      auVar118._12_4_ = auVar44._12_4_ * auVar42._12_4_;
                      auVar50 = vfmsub231ps_fma(auVar118,auVar50,auVar41);
                      auVar135._8_4_ = 1;
                      auVar135._0_8_ = 0x100000001;
                      auVar135._12_4_ = 1;
                      auVar135._16_4_ = 1;
                      auVar135._20_4_ = 1;
                      auVar135._24_4_ = 1;
                      auVar135._28_4_ = 1;
                      local_100 = vpermps_avx2(auVar135,ZEXT1632(auVar38));
                      auVar81 = vpermps_avx2(auVar135,ZEXT1632(auVar50));
                      auVar148._8_4_ = 2;
                      auVar148._0_8_ = 0x200000002;
                      auVar148._12_4_ = 2;
                      auVar148._16_4_ = 2;
                      auVar148._20_4_ = 2;
                      auVar148._24_4_ = 2;
                      auVar148._28_4_ = 2;
                      local_160 = vpermps_avx2(auVar148,ZEXT1632(auVar50));
                      local_140 = auVar50._0_4_;
                      local_180[0] = (RTCHitN)auVar81[0];
                      local_180[1] = (RTCHitN)auVar81[1];
                      local_180[2] = (RTCHitN)auVar81[2];
                      local_180[3] = (RTCHitN)auVar81[3];
                      local_180[4] = (RTCHitN)auVar81[4];
                      local_180[5] = (RTCHitN)auVar81[5];
                      local_180[6] = (RTCHitN)auVar81[6];
                      local_180[7] = (RTCHitN)auVar81[7];
                      local_180[8] = (RTCHitN)auVar81[8];
                      local_180[9] = (RTCHitN)auVar81[9];
                      local_180[10] = (RTCHitN)auVar81[10];
                      local_180[0xb] = (RTCHitN)auVar81[0xb];
                      local_180[0xc] = (RTCHitN)auVar81[0xc];
                      local_180[0xd] = (RTCHitN)auVar81[0xd];
                      local_180[0xe] = (RTCHitN)auVar81[0xe];
                      local_180[0xf] = (RTCHitN)auVar81[0xf];
                      local_180[0x10] = (RTCHitN)auVar81[0x10];
                      local_180[0x11] = (RTCHitN)auVar81[0x11];
                      local_180[0x12] = (RTCHitN)auVar81[0x12];
                      local_180[0x13] = (RTCHitN)auVar81[0x13];
                      local_180[0x14] = (RTCHitN)auVar81[0x14];
                      local_180[0x15] = (RTCHitN)auVar81[0x15];
                      local_180[0x16] = (RTCHitN)auVar81[0x16];
                      local_180[0x17] = (RTCHitN)auVar81[0x17];
                      local_180[0x18] = (RTCHitN)auVar81[0x18];
                      local_180[0x19] = (RTCHitN)auVar81[0x19];
                      local_180[0x1a] = (RTCHitN)auVar81[0x1a];
                      local_180[0x1b] = (RTCHitN)auVar81[0x1b];
                      local_180[0x1c] = (RTCHitN)auVar81[0x1c];
                      local_180[0x1d] = (RTCHitN)auVar81[0x1d];
                      local_180[0x1e] = (RTCHitN)auVar81[0x1e];
                      local_180[0x1f] = (RTCHitN)auVar81[0x1f];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      fStack_11c = local_120;
                      fStack_118 = local_120;
                      fStack_114 = local_120;
                      fStack_110 = local_120;
                      fStack_10c = local_120;
                      fStack_108 = local_120;
                      fStack_104 = local_120;
                      local_e0 = local_200._0_8_;
                      uStack_d8 = local_200._8_8_;
                      uStack_d0 = local_200._16_8_;
                      uStack_c8 = local_200._24_8_;
                      local_c0 = local_220;
                      vpcmpeqd_avx2(local_220,local_220);
                      uStack_9c = context->user->instID[0];
                      local_a0 = uStack_9c;
                      uStack_98 = uStack_9c;
                      uStack_94 = uStack_9c;
                      uStack_90 = uStack_9c;
                      uStack_8c = uStack_9c;
                      uStack_88 = uStack_9c;
                      uStack_84 = uStack_9c;
                      uStack_7c = context->user->instPrimID[0];
                      local_80 = uStack_7c;
                      uStack_78 = uStack_7c;
                      uStack_74 = uStack_7c;
                      uStack_70 = uStack_7c;
                      uStack_6c = uStack_7c;
                      uStack_68 = uStack_7c;
                      uStack_64 = uStack_7c;
                      *(float *)(ray + k * 4 + 0x100) = fVar211;
                      local_400 = local_240;
                      local_430.valid = (int *)local_400;
                      local_430.geometryUserPtr = pGVar5->userPtr;
                      local_430.context = context->user;
                      local_430.ray = (RTCRayN *)ray;
                      local_430.hit = local_180;
                      local_430.N = 8;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar5->occlusionFilterN)(&local_430);
                        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar246 = ZEXT1664(auVar38);
                        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar243 = ZEXT1664(auVar38);
                      }
                      if (local_400 == (undefined1  [32])0x0) {
                        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar242 = ZEXT1664(auVar38);
                        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar238 = ZEXT1664(auVar38);
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar239 = ZEXT3264(auVar81);
                        auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar240 = ZEXT1664(auVar38);
                        auVar241 = ZEXT3264(_DAT_01feed20);
                        auVar38 = vxorps_avx512vl(auVar43,auVar43);
                        auVar244 = ZEXT1664(auVar38);
                      }
                      else {
                        p_Var6 = context->args->filter;
                        if (p_Var6 == (RTCFilterFunctionN)0x0) {
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar242 = ZEXT1664(auVar38);
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar238 = ZEXT1664(auVar38);
                          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar239 = ZEXT3264(auVar81);
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar240 = ZEXT1664(auVar38);
                          auVar241 = ZEXT3264(_DAT_01feed20);
                          auVar38 = vxorps_avx512vl(auVar43,auVar43);
                          auVar244 = ZEXT1664(auVar38);
                        }
                        else {
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar242 = ZEXT1664(auVar38);
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar238 = ZEXT1664(auVar38);
                          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar239 = ZEXT3264(auVar81);
                          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar240 = ZEXT1664(auVar38);
                          auVar241 = ZEXT3264(_DAT_01feed20);
                          auVar38 = vxorps_avx512vl(auVar43,auVar43);
                          auVar244 = ZEXT1664(auVar38);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var6)(&local_430);
                            auVar38 = vxorps_avx512vl(auVar38,auVar38);
                            auVar244 = ZEXT1664(auVar38);
                            auVar241 = ZEXT3264(_DAT_01feed20);
                            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar240 = ZEXT1664(auVar38);
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar239 = ZEXT3264(auVar81);
                            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar238 = ZEXT1664(auVar38);
                            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar246 = ZEXT1664(auVar38);
                            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar243 = ZEXT1664(auVar38);
                            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar242 = ZEXT1664(auVar38);
                          }
                        }
                        auVar245 = ZEXT464(0x3f800000);
                        uVar29 = vptestmd_avx512vl(local_400,local_400);
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar34 = (bool)((byte)uVar29 & 1);
                        bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar32 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar36 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar11 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_430.ray + 0x100) =
                             (uint)bVar34 * auVar81._0_4_ |
                             (uint)!bVar34 * *(int *)(local_430.ray + 0x100);
                        *(uint *)(local_430.ray + 0x104) =
                             (uint)bVar33 * auVar81._4_4_ |
                             (uint)!bVar33 * *(int *)(local_430.ray + 0x104);
                        *(uint *)(local_430.ray + 0x108) =
                             (uint)bVar32 * auVar81._8_4_ |
                             (uint)!bVar32 * *(int *)(local_430.ray + 0x108);
                        *(uint *)(local_430.ray + 0x10c) =
                             (uint)bVar35 * auVar81._12_4_ |
                             (uint)!bVar35 * *(int *)(local_430.ray + 0x10c);
                        *(uint *)(local_430.ray + 0x110) =
                             (uint)bVar36 * auVar81._16_4_ |
                             (uint)!bVar36 * *(int *)(local_430.ray + 0x110);
                        *(uint *)(local_430.ray + 0x114) =
                             (uint)bVar9 * auVar81._20_4_ |
                             (uint)!bVar9 * *(int *)(local_430.ray + 0x114);
                        *(uint *)(local_430.ray + 0x118) =
                             (uint)bVar10 * auVar81._24_4_ |
                             (uint)!bVar10 * *(int *)(local_430.ray + 0x118);
                        *(uint *)(local_430.ray + 0x11c) =
                             (uint)bVar11 * auVar81._28_4_ |
                             (uint)!bVar11 * *(int *)(local_430.ray + 0x11c);
                        bVar26 = 1;
                        if (local_400 != (undefined1  [32])0x0) goto LAB_01ae7cee;
                      }
                      auVar245 = ZEXT464(0x3f800000);
                      *(float *)(ray + k * 4 + 0x100) = fVar212;
                      goto LAB_01ae7cec;
                    }
LAB_01ae7cee:
                    bVar31 = (bool)(bVar31 | bVar26);
                  }
                }
              }
            }
          }
          break;
        }
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
      goto LAB_01ae6e9f;
    }
    auVar109 = vinsertps_avx(auVar139,auVar53,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }